

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [28];
  undefined1 auVar100 [12];
  undefined1 auVar101 [32];
  uint uVar102;
  int iVar103;
  ulong uVar104;
  long lVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  long lVar109;
  bool bVar110;
  bool bVar111;
  undefined4 uVar112;
  undefined8 uVar113;
  float fVar128;
  undefined1 auVar114 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar116 [32];
  undefined1 auVar115 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar127;
  float fVar129;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar134 [16];
  float fVar133;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar136 [32];
  undefined1 auVar135 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar148;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 extraout_var [56];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar175 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar208 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar209 [64];
  undefined4 uVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar219;
  undefined1 auVar216 [16];
  float fVar215;
  undefined8 uVar220;
  undefined8 uVar221;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined8 uVar222;
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  float fVar225;
  float fVar228;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_98d;
  undefined8 local_980;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  ulong local_940;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [8];
  float fStack_708;
  int iStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [16];
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar147 [64];
  undefined1 auVar178 [64];
  
  PVar14 = prim[1];
  uVar104 = (ulong)(byte)PVar14;
  lVar26 = uVar104 * 0x25;
  fVar149 = *(float *)(prim + lVar26 + 0x12);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar21 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar114._0_4_ = fVar149 * auVar21._0_4_;
  auVar114._4_4_ = fVar149 * auVar21._4_4_;
  auVar114._8_4_ = fVar149 * auVar21._8_4_;
  auVar114._12_4_ = fVar149 * auVar21._12_4_;
  auVar151._0_4_ = fVar149 * auVar22._0_4_;
  auVar151._4_4_ = fVar149 * auVar22._4_4_;
  auVar151._8_4_ = fVar149 * auVar22._8_4_;
  auVar151._12_4_ = fVar149 * auVar22._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar104 * 4 + 6);
  auVar116 = vpmovsxbd_avx2(auVar21);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar104 * 5 + 6);
  auVar126 = vpmovsxbd_avx2(auVar22);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar104 * 6 + 6);
  auVar124 = vpmovsxbd_avx2(auVar7);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar104 * 0xf + 6);
  auVar143 = vpmovsxbd_avx2(auVar8);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar217 = vpmovsxbd_avx2(auVar9);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar104 + 6);
  auVar23 = vpmovsxbd_avx2(auVar10);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar104 * 0x1a + 6);
  auVar201 = vpmovsxbd_avx2(auVar11);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar104 * 0x1b + 6);
  auVar24 = vpmovsxbd_avx2(auVar12);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar104 * 0x1c + 6);
  auVar25 = vpmovsxbd_avx2(auVar13);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar226._4_4_ = auVar151._0_4_;
  auVar226._0_4_ = auVar151._0_4_;
  auVar226._8_4_ = auVar151._0_4_;
  auVar226._12_4_ = auVar151._0_4_;
  auVar226._16_4_ = auVar151._0_4_;
  auVar226._20_4_ = auVar151._0_4_;
  auVar226._24_4_ = auVar151._0_4_;
  auVar226._28_4_ = auVar151._0_4_;
  auVar21 = vmovshdup_avx(auVar151);
  uVar113 = auVar21._0_8_;
  auVar229._8_8_ = uVar113;
  auVar229._0_8_ = uVar113;
  auVar229._16_8_ = uVar113;
  auVar229._24_8_ = uVar113;
  auVar21 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar149 = auVar21._0_4_;
  auVar178._0_4_ = fVar149 * auVar124._0_4_;
  fVar150 = auVar21._4_4_;
  auVar178._4_4_ = fVar150 * auVar124._4_4_;
  auVar178._8_4_ = fVar149 * auVar124._8_4_;
  auVar178._12_4_ = fVar150 * auVar124._12_4_;
  auVar178._16_4_ = fVar149 * auVar124._16_4_;
  auVar178._20_4_ = fVar150 * auVar124._20_4_;
  auVar178._28_36_ = in_ZMM10._28_36_;
  auVar178._24_4_ = fVar149 * auVar124._24_4_;
  auVar168._0_4_ = auVar23._0_4_ * fVar149;
  auVar168._4_4_ = auVar23._4_4_ * fVar150;
  auVar168._8_4_ = auVar23._8_4_ * fVar149;
  auVar168._12_4_ = auVar23._12_4_ * fVar150;
  auVar168._16_4_ = auVar23._16_4_ * fVar149;
  auVar168._20_4_ = auVar23._20_4_ * fVar150;
  auVar168._28_36_ = in_ZMM9._28_36_;
  auVar168._24_4_ = auVar23._24_4_ * fVar149;
  auVar198._0_4_ = auVar25._0_4_ * fVar149;
  auVar198._4_4_ = auVar25._4_4_ * fVar150;
  auVar198._8_4_ = auVar25._8_4_ * fVar149;
  auVar198._12_4_ = auVar25._12_4_ * fVar150;
  auVar198._16_4_ = auVar25._16_4_ * fVar149;
  auVar198._20_4_ = auVar25._20_4_ * fVar150;
  auVar198._24_4_ = auVar25._24_4_ * fVar149;
  auVar198._28_4_ = 0;
  auVar21 = vfmadd231ps_fma(auVar178._0_32_,auVar229,auVar126);
  auVar22 = vfmadd231ps_fma(auVar168._0_32_,auVar229,auVar217);
  auVar7 = vfmadd231ps_fma(auVar198,auVar24,auVar229);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar226,auVar116);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar226,auVar143);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar201,auVar226);
  auVar227._4_4_ = auVar114._0_4_;
  auVar227._0_4_ = auVar114._0_4_;
  auVar227._8_4_ = auVar114._0_4_;
  auVar227._12_4_ = auVar114._0_4_;
  auVar227._16_4_ = auVar114._0_4_;
  auVar227._20_4_ = auVar114._0_4_;
  auVar227._24_4_ = auVar114._0_4_;
  auVar227._28_4_ = auVar114._0_4_;
  auVar21 = vmovshdup_avx(auVar114);
  uVar113 = auVar21._0_8_;
  auVar230._8_8_ = uVar113;
  auVar230._0_8_ = uVar113;
  auVar230._16_8_ = uVar113;
  auVar230._24_8_ = uVar113;
  auVar21 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar149 = auVar21._0_4_;
  auVar117._0_4_ = fVar149 * auVar124._0_4_;
  fVar150 = auVar21._4_4_;
  auVar117._4_4_ = fVar150 * auVar124._4_4_;
  auVar117._8_4_ = fVar149 * auVar124._8_4_;
  auVar117._12_4_ = fVar150 * auVar124._12_4_;
  auVar117._16_4_ = fVar149 * auVar124._16_4_;
  auVar117._20_4_ = fVar150 * auVar124._20_4_;
  auVar117._24_4_ = fVar149 * auVar124._24_4_;
  auVar117._28_4_ = 0;
  auVar164._4_4_ = auVar23._4_4_ * fVar150;
  auVar164._0_4_ = auVar23._0_4_ * fVar149;
  auVar164._8_4_ = auVar23._8_4_ * fVar149;
  auVar164._12_4_ = auVar23._12_4_ * fVar150;
  auVar164._16_4_ = auVar23._16_4_ * fVar149;
  auVar164._20_4_ = auVar23._20_4_ * fVar150;
  auVar164._24_4_ = auVar23._24_4_ * fVar149;
  auVar164._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar25._4_4_ * fVar150;
  auVar124._0_4_ = auVar25._0_4_ * fVar149;
  auVar124._8_4_ = auVar25._8_4_ * fVar149;
  auVar124._12_4_ = auVar25._12_4_ * fVar150;
  auVar124._16_4_ = auVar25._16_4_ * fVar149;
  auVar124._20_4_ = auVar25._20_4_ * fVar150;
  auVar124._24_4_ = auVar25._24_4_ * fVar149;
  auVar124._28_4_ = fVar150;
  auVar21 = vfmadd231ps_fma(auVar117,auVar230,auVar126);
  auVar9 = vfmadd231ps_fma(auVar164,auVar230,auVar217);
  auVar10 = vfmadd231ps_fma(auVar124,auVar230,auVar24);
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar227,auVar116);
  auVar151 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar227,auVar143);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  auVar116 = vandps_avx(ZEXT1632(auVar8),local_2c0);
  auVar116 = vcmpps_avx(auVar116,auVar161,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar8),auVar161,auVar116);
  auVar116 = vandps_avx(ZEXT1632(auVar22),local_2c0);
  auVar116 = vcmpps_avx(auVar116,auVar161,1);
  auVar124 = vblendvps_avx(ZEXT1632(auVar22),auVar161,auVar116);
  auVar116 = vandps_avx(ZEXT1632(auVar7),local_2c0);
  auVar116 = vcmpps_avx(auVar116,auVar161,1);
  auVar116 = vblendvps_avx(ZEXT1632(auVar7),auVar161,auVar116);
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar227,auVar201);
  auVar143 = vrcpps_avx(auVar126);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = &DAT_3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar196._16_4_ = 0x3f800000;
  auVar196._20_4_ = 0x3f800000;
  auVar196._24_4_ = 0x3f800000;
  auVar196._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar126,auVar143,auVar196);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar143,auVar143);
  auVar126 = vrcpps_avx(auVar124);
  auVar22 = vfnmadd213ps_fma(auVar124,auVar126,auVar196);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar126,auVar126);
  auVar126 = vrcpps_avx(auVar116);
  auVar7 = vfnmadd213ps_fma(auVar116,auVar126,auVar196);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar126,auVar126);
  fVar149 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar187._4_4_ = fVar149;
  auVar187._0_4_ = fVar149;
  auVar187._8_4_ = fVar149;
  auVar187._12_4_ = fVar149;
  auVar187._16_4_ = fVar149;
  auVar187._20_4_ = fVar149;
  auVar187._24_4_ = fVar149;
  auVar187._28_4_ = fVar149;
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 7 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0xb + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 9 + 6));
  auVar8 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0xd + 6));
  auVar116 = vcvtdq2ps_avx(auVar124);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar9 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x12 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar107 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 2 + uVar107 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 + 6));
  auVar10 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar116 = vcvtdq2ps_avx(auVar124);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x18 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar11 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x1d + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 + (ulong)(byte)PVar14 * 0x20 + 6))
  ;
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar12 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar14 * 0x20 - uVar104) + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x23 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar116);
  auVar13 = vfmadd213ps_fma(auVar126,auVar187,auVar116);
  auVar116 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar114));
  auVar143._4_4_ = auVar21._4_4_ * auVar116._4_4_;
  auVar143._0_4_ = auVar21._0_4_ * auVar116._0_4_;
  auVar143._8_4_ = auVar21._8_4_ * auVar116._8_4_;
  auVar143._12_4_ = auVar21._12_4_ * auVar116._12_4_;
  auVar143._16_4_ = auVar116._16_4_ * 0.0;
  auVar143._20_4_ = auVar116._20_4_ * 0.0;
  auVar143._24_4_ = auVar116._24_4_ * 0.0;
  auVar143._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar114));
  auVar217._4_4_ = auVar21._4_4_ * auVar116._4_4_;
  auVar217._0_4_ = auVar21._0_4_ * auVar116._0_4_;
  auVar217._8_4_ = auVar21._8_4_ * auVar116._8_4_;
  auVar217._12_4_ = auVar21._12_4_ * auVar116._12_4_;
  auVar217._16_4_ = auVar116._16_4_ * 0.0;
  auVar217._20_4_ = auVar116._20_4_ * 0.0;
  auVar217._24_4_ = auVar116._24_4_ * 0.0;
  auVar217._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar151));
  auVar23._4_4_ = auVar22._4_4_ * auVar116._4_4_;
  auVar23._0_4_ = auVar22._0_4_ * auVar116._0_4_;
  auVar23._8_4_ = auVar22._8_4_ * auVar116._8_4_;
  auVar23._12_4_ = auVar22._12_4_ * auVar116._12_4_;
  auVar23._16_4_ = auVar116._16_4_ * 0.0;
  auVar23._20_4_ = auVar116._20_4_ * 0.0;
  auVar23._24_4_ = auVar116._24_4_ * 0.0;
  auVar23._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar151));
  auVar201._4_4_ = auVar22._4_4_ * auVar116._4_4_;
  auVar201._0_4_ = auVar22._0_4_ * auVar116._0_4_;
  auVar201._8_4_ = auVar22._8_4_ * auVar116._8_4_;
  auVar201._12_4_ = auVar22._12_4_ * auVar116._12_4_;
  auVar201._16_4_ = auVar116._16_4_ * 0.0;
  auVar201._20_4_ = auVar116._20_4_ * 0.0;
  auVar201._24_4_ = auVar116._24_4_ * 0.0;
  auVar201._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar27));
  auVar24._4_4_ = auVar7._4_4_ * auVar116._4_4_;
  auVar24._0_4_ = auVar7._0_4_ * auVar116._0_4_;
  auVar24._8_4_ = auVar7._8_4_ * auVar116._8_4_;
  auVar24._12_4_ = auVar7._12_4_ * auVar116._12_4_;
  auVar24._16_4_ = auVar116._16_4_ * 0.0;
  auVar24._20_4_ = auVar116._20_4_ * 0.0;
  auVar24._24_4_ = auVar116._24_4_ * 0.0;
  auVar24._28_4_ = auVar116._28_4_;
  auVar116 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar27));
  auVar25._4_4_ = auVar7._4_4_ * auVar116._4_4_;
  auVar25._0_4_ = auVar7._0_4_ * auVar116._0_4_;
  auVar25._8_4_ = auVar7._8_4_ * auVar116._8_4_;
  auVar25._12_4_ = auVar7._12_4_ * auVar116._12_4_;
  auVar25._16_4_ = auVar116._16_4_ * 0.0;
  auVar25._20_4_ = auVar116._20_4_ * 0.0;
  auVar25._24_4_ = auVar116._24_4_ * 0.0;
  auVar25._28_4_ = auVar116._28_4_;
  auVar116 = vpminsd_avx2(auVar143,auVar217);
  auVar126 = vpminsd_avx2(auVar23,auVar201);
  auVar116 = vmaxps_avx(auVar116,auVar126);
  auVar126 = vpminsd_avx2(auVar24,auVar25);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar199._4_4_ = uVar112;
  auVar199._0_4_ = uVar112;
  auVar199._8_4_ = uVar112;
  auVar199._12_4_ = uVar112;
  auVar199._16_4_ = uVar112;
  auVar199._20_4_ = uVar112;
  auVar199._24_4_ = uVar112;
  auVar199._28_4_ = uVar112;
  auVar126 = vmaxps_avx(auVar126,auVar199);
  auVar116 = vmaxps_avx(auVar116,auVar126);
  local_80._4_4_ = auVar116._4_4_ * 0.99999964;
  local_80._0_4_ = auVar116._0_4_ * 0.99999964;
  local_80._8_4_ = auVar116._8_4_ * 0.99999964;
  local_80._12_4_ = auVar116._12_4_ * 0.99999964;
  local_80._16_4_ = auVar116._16_4_ * 0.99999964;
  local_80._20_4_ = auVar116._20_4_ * 0.99999964;
  local_80._24_4_ = auVar116._24_4_ * 0.99999964;
  local_80._28_4_ = auVar116._28_4_;
  auVar116 = vpmaxsd_avx2(auVar143,auVar217);
  auVar126 = vpmaxsd_avx2(auVar23,auVar201);
  auVar116 = vminps_avx(auVar116,auVar126);
  auVar126 = vpmaxsd_avx2(auVar24,auVar25);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar138._4_4_ = uVar112;
  auVar138._0_4_ = uVar112;
  auVar138._8_4_ = uVar112;
  auVar138._12_4_ = uVar112;
  auVar138._16_4_ = uVar112;
  auVar138._20_4_ = uVar112;
  auVar138._24_4_ = uVar112;
  auVar138._28_4_ = uVar112;
  auVar126 = vminps_avx(auVar126,auVar138);
  auVar116 = vminps_avx(auVar116,auVar126);
  auVar126._4_4_ = auVar116._4_4_ * 1.0000004;
  auVar126._0_4_ = auVar116._0_4_ * 1.0000004;
  auVar126._8_4_ = auVar116._8_4_ * 1.0000004;
  auVar126._12_4_ = auVar116._12_4_ * 1.0000004;
  auVar126._16_4_ = auVar116._16_4_ * 1.0000004;
  auVar126._20_4_ = auVar116._20_4_ * 1.0000004;
  auVar126._24_4_ = auVar116._24_4_ * 1.0000004;
  auVar126._28_4_ = auVar116._28_4_;
  auVar136._1_3_ = 0;
  auVar136[0] = PVar14;
  auVar136[4] = PVar14;
  auVar136._5_3_ = 0;
  auVar136[8] = PVar14;
  auVar136._9_3_ = 0;
  auVar136[0xc] = PVar14;
  auVar136._13_3_ = 0;
  auVar136[0x10] = PVar14;
  auVar136._17_3_ = 0;
  auVar136[0x14] = PVar14;
  auVar136._21_3_ = 0;
  auVar136[0x18] = PVar14;
  auVar136._25_3_ = 0;
  auVar136[0x1c] = PVar14;
  auVar136._29_3_ = 0;
  auVar116 = vcmpps_avx(local_80,auVar126,2);
  auVar126 = vpcmpgtd_avx2(auVar136,_DAT_0205a920);
  auVar116 = vandps_avx(auVar116,auVar126);
  uVar102 = vmovmskps_avx(auVar116);
  local_98d = uVar102 != 0;
  if (local_98d) {
    uVar102 = uVar102 & 0xff;
    local_5e8 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    iVar103 = 1 << ((uint)k & 0x1f);
    auVar116._4_4_ = iVar103;
    auVar116._0_4_ = iVar103;
    auVar116._8_4_ = iVar103;
    auVar116._12_4_ = iVar103;
    auVar116._16_4_ = iVar103;
    auVar116._20_4_ = iVar103;
    auVar116._24_4_ = iVar103;
    auVar116._28_4_ = iVar103;
    auVar126 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar116 = vpand_avx2(auVar116,auVar126);
    local_2e0 = vpcmpeqd_avx2(auVar116,auVar126);
    local_450 = 0x7fffffff;
    uStack_44c = 0x7fffffff;
    uStack_448 = 0x7fffffff;
    uStack_444 = 0x7fffffff;
    do {
      auVar116 = local_580;
      lVar26 = 0;
      for (uVar104 = (ulong)uVar102; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000
          ) {
        lVar26 = lVar26 + 1;
      }
      uVar15 = *(uint *)(prim + 2);
      local_6e0._4_4_ = *(undefined4 *)(prim + lVar26 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[uVar15].ptr;
      local_5a0._0_8_ = CONCAT44(0,local_6e0._4_4_);
      uVar104 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,local_6e0._4_4_) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar149 = (pGVar16->time_range).lower;
      fVar149 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar149) /
                ((pGVar16->time_range).upper - fVar149));
      auVar21 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
      auVar21 = vminss_avx(auVar21,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x20,auVar21);
      fVar149 = fVar149 - auVar21._0_4_;
      fVar150 = 1.0 - fVar149;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar105 = (long)(int)auVar21._0_4_ * 0x38;
      lVar109 = *(long *)(_Var17 + 0x10 + lVar105);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar105);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar105);
      pfVar1 = (float *)(lVar18 + lVar19 * uVar104);
      auVar152._0_4_ = fVar149 * *pfVar1;
      auVar152._4_4_ = fVar149 * pfVar1[1];
      auVar152._8_4_ = fVar149 * pfVar1[2];
      auVar152._12_4_ = fVar149 * pfVar1[3];
      lVar26 = uVar104 + 1;
      pfVar1 = (float *)(lVar18 + lVar19 * lVar26);
      auVar169._0_4_ = fVar149 * *pfVar1;
      auVar169._4_4_ = fVar149 * pfVar1[1];
      auVar169._8_4_ = fVar149 * pfVar1[2];
      auVar169._12_4_ = fVar149 * pfVar1[3];
      p_Var20 = pGVar16[4].occlusionFilterN;
      auVar115._4_4_ = fVar150;
      auVar115._0_4_ = fVar150;
      auVar115._8_4_ = fVar150;
      auVar115._12_4_ = fVar150;
      auVar10 = vfmadd231ps_fma(auVar152,auVar115,
                                *(undefined1 (*) [16])
                                 (*(long *)(_Var17 + lVar105) + lVar109 * uVar104));
      local_600 = vfmadd231ps_fma(auVar169,auVar115,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var17 + lVar105) + lVar109 * lVar26));
      pfVar1 = (float *)(*(long *)(p_Var20 + lVar105 + 0x38) +
                        uVar104 * *(long *)(p_Var20 + lVar105 + 0x48));
      auVar170._0_4_ = fVar149 * *pfVar1;
      auVar170._4_4_ = fVar149 * pfVar1[1];
      auVar170._8_4_ = fVar149 * pfVar1[2];
      auVar170._12_4_ = fVar149 * pfVar1[3];
      pfVar1 = (float *)(*(long *)(p_Var20 + lVar105 + 0x38) +
                        *(long *)(p_Var20 + lVar105 + 0x48) * lVar26);
      auVar134._0_4_ = fVar149 * *pfVar1;
      auVar134._4_4_ = fVar149 * pfVar1[1];
      auVar134._8_4_ = fVar149 * pfVar1[2];
      auVar134._12_4_ = fVar149 * pfVar1[3];
      auVar22 = vfmadd231ps_fma(auVar170,auVar115,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var20 + lVar105) +
                                 *(long *)(p_Var20 + lVar105 + 0x10) * uVar104));
      auVar7 = vfmadd231ps_fma(auVar134,auVar115,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var20 + lVar105) +
                                *(long *)(p_Var20 + lVar105 + 0x10) * lVar26));
      iVar103 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar26 = (long)iVar103 * 0x44;
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar8 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar135._8_4_ = 0xbeaaaaab;
      auVar135._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar135._12_4_ = 0xbeaaaaab;
      local_610 = vfnmadd213ps_fma(auVar22,auVar135,auVar10);
      local_620 = vfmadd213ps_fma(auVar7,auVar135,local_600);
      auVar22 = vsubps_avx(auVar10,auVar8);
      uVar112 = auVar22._0_4_;
      auVar153._4_4_ = uVar112;
      auVar153._0_4_ = uVar112;
      auVar153._8_4_ = uVar112;
      auVar153._12_4_ = uVar112;
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      aVar5 = (local_5e8->vx).field_0;
      aVar6 = (local_5e8->vy).field_0;
      fVar149 = (local_5e8->vz).field_0.m128[0];
      fVar150 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar127 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar128 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar203._0_4_ = fVar149 * auVar22._0_4_;
      auVar203._4_4_ = fVar150 * auVar22._4_4_;
      auVar203._8_4_ = fVar127 * auVar22._8_4_;
      auVar203._12_4_ = fVar128 * auVar22._12_4_;
      auVar21 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar21);
      auVar11 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar5,auVar153);
      auVar21 = vblendps_avx(auVar11,auVar10,8);
      auVar7 = vsubps_avx(local_610,auVar8);
      uVar112 = auVar7._0_4_;
      auVar171._4_4_ = uVar112;
      auVar171._0_4_ = uVar112;
      auVar171._8_4_ = uVar112;
      auVar171._12_4_ = uVar112;
      auVar22 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar204._0_4_ = fVar149 * auVar7._0_4_;
      auVar204._4_4_ = fVar150 * auVar7._4_4_;
      auVar204._8_4_ = fVar127 * auVar7._8_4_;
      auVar204._12_4_ = fVar128 * auVar7._12_4_;
      auVar22 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar22);
      auVar12 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar5,auVar171);
      auVar22 = vblendps_avx(auVar12,local_610,8);
      auVar9 = vsubps_avx(local_620,auVar8);
      uVar112 = auVar9._0_4_;
      auVar194._4_4_ = uVar112;
      auVar194._0_4_ = uVar112;
      auVar194._8_4_ = uVar112;
      auVar194._12_4_ = uVar112;
      auVar7 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar211._0_4_ = fVar149 * auVar9._0_4_;
      auVar211._4_4_ = fVar150 * auVar9._4_4_;
      auVar211._8_4_ = fVar127 * auVar9._8_4_;
      auVar211._12_4_ = fVar128 * auVar9._12_4_;
      auVar7 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar7);
      auVar13 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar5,auVar194);
      auVar7 = vblendps_avx(auVar13,local_620,8);
      auVar9 = vsubps_avx(local_600,auVar8);
      uVar112 = auVar9._0_4_;
      auVar195._4_4_ = uVar112;
      auVar195._0_4_ = uVar112;
      auVar195._8_4_ = uVar112;
      auVar195._12_4_ = uVar112;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar216._0_4_ = fVar149 * auVar9._0_4_;
      auVar216._4_4_ = fVar150 * auVar9._4_4_;
      auVar216._8_4_ = fVar127 * auVar9._8_4_;
      auVar216._12_4_ = fVar128 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar6,auVar8);
      auVar114 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar5,auVar195);
      auVar8 = vblendps_avx(auVar114,local_600,8);
      auVar27._4_4_ = uStack_44c;
      auVar27._0_4_ = local_450;
      auVar27._8_4_ = uStack_448;
      auVar27._12_4_ = uStack_444;
      auVar21 = vandps_avx(auVar21,auVar27);
      auVar22 = vandps_avx(auVar22,auVar27);
      auVar9 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vandps_avx(auVar7,auVar27);
      auVar22 = vandps_avx(auVar8,auVar27);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar9,auVar21);
      auVar22 = vmovshdup_avx(auVar21);
      auVar22 = vmaxss_avx(auVar22,auVar21);
      auVar21 = vshufpd_avx(auVar21,auVar21,1);
      auVar21 = vmaxss_avx(auVar21,auVar22);
      auVar22 = vmovshdup_avx(auVar11);
      uVar113 = auVar22._0_8_;
      local_540._8_8_ = uVar113;
      local_540._0_8_ = uVar113;
      local_540._16_8_ = uVar113;
      local_540._24_8_ = uVar113;
      auVar22 = vmovshdup_avx(auVar12);
      uVar113 = auVar22._0_8_;
      local_6a0._8_8_ = uVar113;
      local_6a0._0_8_ = uVar113;
      local_6a0._16_8_ = uVar113;
      local_6a0._24_8_ = uVar113;
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      uVar210 = auVar13._0_4_;
      auVar160._4_4_ = uVar210;
      auVar160._0_4_ = uVar210;
      auVar160._8_4_ = uVar210;
      auVar160._12_4_ = uVar210;
      auVar160._16_4_ = uVar210;
      auVar160._20_4_ = uVar210;
      auVar160._24_4_ = uVar210;
      auVar160._28_4_ = uVar210;
      auVar22 = vmovshdup_avx(auVar13);
      uVar113 = auVar22._0_8_;
      auVar212._8_8_ = uVar113;
      auVar212._0_8_ = uVar113;
      auVar212._16_8_ = uVar113;
      auVar212._24_8_ = uVar113;
      fVar149 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar26 + 0xd8c);
      auVar98 = *(undefined1 (*) [28])(bezier_basis0 + lVar26 + 0xd8c);
      auVar22 = vmovshdup_avx(auVar114);
      fVar214 = auVar114._0_4_;
      auVar137._0_4_ = fVar214 * fVar149;
      auVar137._4_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xd90);
      auVar137._8_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xd94);
      auVar137._12_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xd98);
      auVar137._16_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xd9c);
      auVar137._20_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xda0);
      auVar137._24_4_ = fVar214 * *(float *)(bezier_basis0 + lVar26 + 0xda4);
      auVar137._28_4_ = 0;
      auVar7 = vfmadd231ps_fma(auVar137,auVar126,auVar160);
      fVar225 = auVar22._0_4_;
      auVar186._0_4_ = fVar225 * fVar149;
      fVar228 = auVar22._4_4_;
      auVar186._4_4_ = fVar228 * *(float *)(bezier_basis0 + lVar26 + 0xd90);
      auVar186._8_4_ = fVar225 * *(float *)(bezier_basis0 + lVar26 + 0xd94);
      auVar186._12_4_ = fVar228 * *(float *)(bezier_basis0 + lVar26 + 0xd98);
      auVar186._16_4_ = fVar225 * *(float *)(bezier_basis0 + lVar26 + 0xd9c);
      auVar186._20_4_ = fVar228 * *(float *)(bezier_basis0 + lVar26 + 0xda0);
      auVar186._24_4_ = fVar225 * *(float *)(bezier_basis0 + lVar26 + 0xda4);
      auVar186._28_4_ = 0;
      auVar22 = vfmadd231ps_fma(auVar186,auVar126,auVar212);
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      uVar112 = auVar12._0_4_;
      auVar182._4_4_ = uVar112;
      auVar182._0_4_ = uVar112;
      auVar182._8_4_ = uVar112;
      auVar182._12_4_ = uVar112;
      auVar182._16_4_ = uVar112;
      auVar182._20_4_ = uVar112;
      auVar182._24_4_ = uVar112;
      auVar182._28_4_ = uVar112;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar124,auVar182);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar124,local_6a0);
      auVar143 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar112 = auVar11._0_4_;
      auVar174._4_4_ = uVar112;
      auVar174._0_4_ = uVar112;
      auVar174._8_4_ = uVar112;
      auVar174._12_4_ = uVar112;
      auVar174._16_4_ = uVar112;
      auVar174._20_4_ = uVar112;
      auVar174._24_4_ = uVar112;
      auVar174._28_4_ = uVar112;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar143,auVar174);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar143,local_540);
      auVar217 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      fVar132 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar26 + 0xd8c);
      fVar215 = *(float *)(bezier_basis1 + lVar26 + 0xd90);
      fVar219 = *(float *)(bezier_basis1 + lVar26 + 0xd94);
      fVar88 = *(float *)(bezier_basis1 + lVar26 + 0xd98);
      fVar89 = *(float *)(bezier_basis1 + lVar26 + 0xd9c);
      fVar90 = *(float *)(bezier_basis1 + lVar26 + 0xda0);
      fVar91 = *(float *)(bezier_basis1 + lVar26 + 0xda4);
      auVar99 = *(undefined1 (*) [28])(bezier_basis1 + lVar26 + 0xd8c);
      auVar28._4_4_ = fVar214 * fVar215;
      auVar28._0_4_ = fVar214 * fVar132;
      auVar28._8_4_ = fVar214 * fVar219;
      auVar28._12_4_ = fVar214 * fVar88;
      auVar28._16_4_ = fVar214 * fVar89;
      auVar28._20_4_ = fVar214 * fVar90;
      auVar28._24_4_ = fVar214 * fVar91;
      auVar28._28_4_ = fVar214;
      auVar8 = vfmadd231ps_fma(auVar28,auVar217,auVar160);
      auVar29._4_4_ = fVar228 * fVar215;
      auVar29._0_4_ = fVar225 * fVar132;
      auVar29._8_4_ = fVar225 * fVar219;
      auVar29._12_4_ = fVar228 * fVar88;
      auVar29._16_4_ = fVar225 * fVar89;
      auVar29._20_4_ = fVar228 * fVar90;
      auVar29._24_4_ = fVar225 * fVar91;
      auVar29._28_4_ = uVar210;
      auVar9 = vfmadd231ps_fma(auVar29,auVar217,auVar212);
      auVar23 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar23,auVar182);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar23,local_6a0);
      auVar201 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar201,auVar174);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar201,local_540);
      auVar117 = ZEXT1632(auVar8);
      auVar138 = ZEXT1632(auVar7);
      auVar25 = vsubps_avx(auVar117,auVar138);
      auVar161 = ZEXT1632(auVar9);
      auVar187 = ZEXT1632(auVar22);
      auVar164 = vsubps_avx(auVar161,auVar187);
      auVar118._0_4_ = auVar25._0_4_ * auVar22._0_4_;
      auVar118._4_4_ = auVar25._4_4_ * auVar22._4_4_;
      auVar118._8_4_ = auVar25._8_4_ * auVar22._8_4_;
      auVar118._12_4_ = auVar25._12_4_ * auVar22._12_4_;
      auVar118._16_4_ = auVar25._16_4_ * 0.0;
      auVar118._20_4_ = auVar25._20_4_ * 0.0;
      auVar118._24_4_ = auVar25._24_4_ * 0.0;
      auVar118._28_4_ = 0;
      fVar149 = auVar164._0_4_;
      auVar139._0_4_ = auVar7._0_4_ * fVar149;
      fVar150 = auVar164._4_4_;
      auVar139._4_4_ = auVar7._4_4_ * fVar150;
      fVar127 = auVar164._8_4_;
      auVar139._8_4_ = auVar7._8_4_ * fVar127;
      fVar128 = auVar164._12_4_;
      auVar139._12_4_ = auVar7._12_4_ * fVar128;
      fVar129 = auVar164._16_4_;
      auVar139._16_4_ = fVar129 * 0.0;
      fVar130 = auVar164._20_4_;
      auVar139._20_4_ = fVar130 * 0.0;
      fVar131 = auVar164._24_4_;
      auVar139._24_4_ = fVar131 * 0.0;
      auVar139._28_4_ = 0;
      auVar136 = vsubps_avx(auVar118,auVar139);
      auVar22 = vpermilps_avx(auVar10,0xff);
      uVar113 = auVar22._0_8_;
      local_a0._8_8_ = uVar113;
      local_a0._0_8_ = uVar113;
      local_a0._16_8_ = uVar113;
      local_a0._24_8_ = uVar113;
      auVar7 = vpermilps_avx(local_610,0xff);
      uVar113 = auVar7._0_8_;
      auVar175._8_8_ = uVar113;
      auVar175._0_8_ = uVar113;
      auVar175._16_8_ = uVar113;
      auVar175._24_8_ = uVar113;
      auVar178 = ZEXT3264(auVar175);
      auVar7 = vpermilps_avx(local_620,0xff);
      uVar113 = auVar7._0_8_;
      local_c0._8_8_ = uVar113;
      local_c0._0_8_ = uVar113;
      local_c0._16_8_ = uVar113;
      local_c0._24_8_ = uVar113;
      auVar7 = vpermilps_avx(local_600,0xff);
      local_e0 = auVar7._0_8_;
      local_980._0_4_ = auVar98._0_4_;
      local_980._4_4_ = auVar98._4_4_;
      fStack_978 = auVar98._8_4_;
      fStack_974 = auVar98._12_4_;
      fStack_970 = auVar98._16_4_;
      fStack_96c = auVar98._20_4_;
      fStack_968 = auVar98._24_4_;
      fVar133 = auVar7._0_4_;
      fVar148 = auVar7._4_4_;
      auVar30._4_4_ = fVar148 * local_980._4_4_;
      auVar30._0_4_ = fVar133 * (float)local_980;
      auVar30._8_4_ = fVar133 * fStack_978;
      auVar30._12_4_ = fVar148 * fStack_974;
      auVar30._16_4_ = fVar133 * fStack_970;
      auVar30._20_4_ = fVar148 * fStack_96c;
      auVar30._24_4_ = fVar133 * fStack_968;
      auVar30._28_4_ = fVar228;
      auVar7 = vfmadd231ps_fma(auVar30,auVar126,local_c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar124,auVar175);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar143,local_a0);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar31._4_4_ = fVar148 * fVar215;
      auVar31._0_4_ = fVar133 * fVar132;
      auVar31._8_4_ = fVar133 * fVar219;
      auVar31._12_4_ = fVar148 * fVar88;
      auVar31._16_4_ = fVar133 * fVar89;
      auVar31._20_4_ = fVar148 * fVar90;
      auVar31._24_4_ = fVar133 * fVar91;
      auVar31._28_4_ = auVar143._28_4_;
      auVar8 = vfmadd231ps_fma(auVar31,auVar217,local_c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar23,auVar175);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar201,local_a0);
      auVar32._4_4_ = fVar150 * fVar150;
      auVar32._0_4_ = fVar149 * fVar149;
      auVar32._8_4_ = fVar127 * fVar127;
      auVar32._12_4_ = fVar128 * fVar128;
      auVar32._16_4_ = fVar129 * fVar129;
      auVar32._20_4_ = fVar130 * fVar130;
      auVar32._24_4_ = fVar131 * fVar131;
      auVar32._28_4_ = auVar22._4_4_;
      auVar22 = vfmadd231ps_fma(auVar32,auVar25,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
      auVar33._4_4_ = auVar24._4_4_ * auVar24._4_4_ * auVar22._4_4_;
      auVar33._0_4_ = auVar24._0_4_ * auVar24._0_4_ * auVar22._0_4_;
      auVar33._8_4_ = auVar24._8_4_ * auVar24._8_4_ * auVar22._8_4_;
      auVar33._12_4_ = auVar24._12_4_ * auVar24._12_4_ * auVar22._12_4_;
      auVar33._16_4_ = auVar24._16_4_ * auVar24._16_4_ * 0.0;
      auVar33._20_4_ = auVar24._20_4_ * auVar24._20_4_ * 0.0;
      auVar33._24_4_ = auVar24._24_4_ * auVar24._24_4_ * 0.0;
      auVar33._28_4_ = auVar24._28_4_;
      auVar34._4_4_ = auVar136._4_4_ * auVar136._4_4_;
      auVar34._0_4_ = auVar136._0_4_ * auVar136._0_4_;
      auVar34._8_4_ = auVar136._8_4_ * auVar136._8_4_;
      auVar34._12_4_ = auVar136._12_4_ * auVar136._12_4_;
      auVar34._16_4_ = auVar136._16_4_ * auVar136._16_4_;
      auVar34._20_4_ = auVar136._20_4_ * auVar136._20_4_;
      auVar34._24_4_ = auVar136._24_4_ * auVar136._24_4_;
      auVar34._28_4_ = auVar136._28_4_;
      auVar24 = vcmpps_avx(auVar34,auVar33,2);
      auVar168 = ZEXT3264(auVar24);
      fVar149 = auVar21._0_4_ * 4.7683716e-07;
      auVar119._0_4_ = (float)iVar103;
      local_580._4_12_ = auVar114._4_12_;
      local_580._0_4_ = auVar119._0_4_;
      local_580._16_16_ = auVar116._16_16_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar119._16_4_ = auVar119._0_4_;
      auVar119._20_4_ = auVar119._0_4_;
      auVar119._24_4_ = auVar119._0_4_;
      auVar119._28_4_ = auVar119._0_4_;
      auVar116 = vcmpps_avx(_DAT_02020f40,auVar119,1);
      auVar21 = vpermilps_avx(auVar11,0xaa);
      uVar113 = auVar21._0_8_;
      local_5c0._8_8_ = uVar113;
      local_5c0._0_8_ = uVar113;
      local_5c0._16_8_ = uVar113;
      local_5c0._24_8_ = uVar113;
      auVar21 = vpermilps_avx(auVar12,0xaa);
      uVar113 = auVar21._0_8_;
      local_520._8_8_ = uVar113;
      local_520._0_8_ = uVar113;
      local_520._16_8_ = uVar113;
      local_520._24_8_ = uVar113;
      auVar22 = vpermilps_avx(auVar13,0xaa);
      uVar113 = auVar22._0_8_;
      local_480._8_8_ = uVar113;
      local_480._0_8_ = uVar113;
      local_480._16_8_ = uVar113;
      local_480._24_8_ = uVar113;
      auVar21 = vshufps_avx(auVar114,auVar114,0xaa);
      uVar113 = auVar21._0_8_;
      auVar136 = auVar116 & auVar24;
      uVar106 = *(uint *)(ray + k * 4 + 0x60);
      _local_780 = ZEXT416(uVar106);
      local_7d0 = auVar10._0_8_;
      uStack_7c8 = auVar10._8_8_;
      uVar220 = uVar113;
      uVar221 = uVar113;
      uVar222 = uVar113;
      if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar136 >> 0x7f,0) == '\0') &&
            (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar136 >> 0xbf,0) == '\0') &&
          (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar136[0x1f]) {
        bVar111 = false;
        auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(fVar214,
                                                  CONCAT412(fVar214,CONCAT48(fVar214,CONCAT44(
                                                  fVar214,fVar214))))))));
      }
      else {
        local_4a0 = vandps_avx(auVar24,auVar116);
        local_720._0_4_ = auVar99._0_4_;
        local_720._4_4_ = auVar99._4_4_;
        fStack_718 = auVar99._8_4_;
        fStack_714 = auVar99._12_4_;
        auStack_710._0_4_ = auVar99._16_4_;
        auStack_710._4_4_ = auVar99._20_4_;
        fStack_708 = auVar99._24_4_;
        fVar215 = auVar21._0_4_;
        fVar219 = auVar21._4_4_;
        auVar35._4_4_ = fVar219 * (float)local_720._4_4_;
        auVar35._0_4_ = fVar215 * (float)local_720._0_4_;
        auVar35._8_4_ = fVar215 * fStack_718;
        auVar35._12_4_ = fVar219 * fStack_714;
        auVar35._16_4_ = fVar215 * (float)auStack_710._0_4_;
        auVar35._20_4_ = fVar219 * (float)auStack_710._4_4_;
        auVar35._24_4_ = fVar215 * fStack_708;
        auVar35._28_4_ = local_4a0._28_4_;
        auVar21 = vfmadd213ps_fma(auVar217,local_480,auVar35);
        auVar21 = vfmadd213ps_fma(auVar23,local_520,ZEXT1632(auVar21));
        auVar21 = vfmadd213ps_fma(auVar201,local_5c0,ZEXT1632(auVar21));
        auVar120._0_4_ = fVar215 * (float)local_980;
        auVar120._4_4_ = fVar219 * local_980._4_4_;
        auVar120._8_4_ = fVar215 * fStack_978;
        auVar120._12_4_ = fVar219 * fStack_974;
        auVar120._16_4_ = fVar215 * fStack_970;
        auVar120._20_4_ = fVar219 * fStack_96c;
        auVar120._24_4_ = fVar215 * fStack_968;
        auVar120._28_4_ = 0;
        auVar9 = vfmadd213ps_fma(auVar126,local_480,auVar120);
        auVar9 = vfmadd213ps_fma(auVar124,local_520,ZEXT1632(auVar9));
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        fVar150 = *(float *)(bezier_basis0 + lVar26 + 0x1f9c);
        fVar127 = *(float *)(bezier_basis0 + lVar26 + 0x1fa0);
        fVar128 = *(float *)(bezier_basis0 + lVar26 + 0x1fa4);
        fVar129 = *(float *)(bezier_basis0 + lVar26 + 0x1fa8);
        fVar130 = *(float *)(bezier_basis0 + lVar26 + 0x1fac);
        fVar131 = *(float *)(bezier_basis0 + lVar26 + 0x1fb0);
        fVar132 = *(float *)(bezier_basis0 + lVar26 + 0x1fb4);
        auVar188._0_4_ = fVar150 * fVar214;
        auVar188._4_4_ = fVar127 * fVar214;
        auVar188._8_4_ = fVar128 * fVar214;
        auVar188._12_4_ = fVar129 * fVar214;
        auVar188._16_4_ = fVar130 * fVar214;
        auVar188._20_4_ = fVar131 * fVar214;
        auVar188._24_4_ = fVar132 * fVar214;
        auVar188._28_4_ = 0;
        auVar200._0_4_ = fVar225 * fVar150;
        auVar200._4_4_ = fVar228 * fVar127;
        auVar200._8_4_ = fVar225 * fVar128;
        auVar200._12_4_ = fVar228 * fVar129;
        auVar200._16_4_ = fVar225 * fVar130;
        auVar200._20_4_ = fVar228 * fVar131;
        auVar200._24_4_ = fVar225 * fVar132;
        auVar200._28_4_ = 0;
        auVar208._0_4_ = fVar215 * fVar150;
        auVar208._4_4_ = fVar219 * fVar127;
        auVar208._8_4_ = fVar215 * fVar128;
        auVar208._12_4_ = fVar219 * fVar129;
        auVar208._16_4_ = fVar215 * fVar130;
        auVar208._20_4_ = fVar219 * fVar131;
        auVar208._24_4_ = fVar215 * fVar132;
        auVar208._28_4_ = 0;
        auVar11 = vfmadd231ps_fma(auVar188,auVar124,auVar160);
        auVar12 = vfmadd231ps_fma(auVar200,auVar124,auVar212);
        auVar13 = vfmadd231ps_fma(auVar208,local_480,auVar124);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,auVar182);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_6a0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar126,local_520);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar116,auVar174);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar116,local_540);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5c0,auVar116);
        fVar150 = *(float *)(bezier_basis1 + lVar26 + 0x1f9c);
        fVar127 = *(float *)(bezier_basis1 + lVar26 + 0x1fa0);
        fVar128 = *(float *)(bezier_basis1 + lVar26 + 0x1fa4);
        fVar129 = *(float *)(bezier_basis1 + lVar26 + 0x1fa8);
        fVar130 = *(float *)(bezier_basis1 + lVar26 + 0x1fac);
        fVar131 = *(float *)(bezier_basis1 + lVar26 + 0x1fb0);
        fVar132 = *(float *)(bezier_basis1 + lVar26 + 0x1fb4);
        auVar36._4_4_ = fVar214 * fVar127;
        auVar36._0_4_ = fVar214 * fVar150;
        auVar36._8_4_ = fVar214 * fVar128;
        auVar36._12_4_ = fVar214 * fVar129;
        auVar36._16_4_ = fVar214 * fVar130;
        auVar36._20_4_ = fVar214 * fVar131;
        auVar36._24_4_ = fVar214 * fVar132;
        auVar36._28_4_ = auVar22._4_4_;
        auVar37._4_4_ = fVar228 * fVar127;
        auVar37._0_4_ = fVar225 * fVar150;
        auVar37._8_4_ = fVar225 * fVar128;
        auVar37._12_4_ = fVar228 * fVar129;
        auVar37._16_4_ = fVar225 * fVar130;
        auVar37._20_4_ = fVar228 * fVar131;
        auVar37._24_4_ = fVar225 * fVar132;
        auVar37._28_4_ = fVar228;
        auVar38._4_4_ = fVar219 * fVar127;
        auVar38._0_4_ = fVar215 * fVar150;
        auVar38._8_4_ = fVar215 * fVar128;
        auVar38._12_4_ = fVar219 * fVar129;
        auVar38._16_4_ = fVar215 * fVar130;
        auVar38._20_4_ = fVar219 * fVar131;
        auVar38._24_4_ = fVar215 * fVar132;
        auVar38._28_4_ = fVar219;
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar22 = vfmadd231ps_fma(auVar36,auVar116,auVar160);
        auVar114 = vfmadd231ps_fma(auVar37,auVar116,auVar212);
        auVar151 = vfmadd231ps_fma(auVar38,local_480,auVar116);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar116,auVar182);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar116,local_6a0);
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar116,local_520);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar116,auVar174);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar116,local_540);
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_5c0,auVar116);
        auVar116 = vandps_avx(local_2c0,ZEXT1632(auVar11));
        auVar126 = vandps_avx(ZEXT1632(auVar12),local_2c0);
        auVar126 = vmaxps_avx(auVar116,auVar126);
        auVar116 = vandps_avx(ZEXT1632(auVar13),local_2c0);
        auVar116 = vmaxps_avx(auVar126,auVar116);
        auVar140._4_4_ = fVar149;
        auVar140._0_4_ = fVar149;
        auVar140._8_4_ = fVar149;
        auVar140._12_4_ = fVar149;
        auVar140._16_4_ = fVar149;
        auVar140._20_4_ = fVar149;
        auVar140._24_4_ = fVar149;
        auVar140._28_4_ = fVar149;
        auVar116 = vcmpps_avx(auVar116,auVar140,1);
        auVar124 = vblendvps_avx(ZEXT1632(auVar11),auVar25,auVar116);
        auVar217 = vblendvps_avx(ZEXT1632(auVar12),auVar164,auVar116);
        auVar116 = vandps_avx(ZEXT1632(auVar22),local_2c0);
        auVar126 = vandps_avx(ZEXT1632(auVar114),local_2c0);
        auVar126 = vmaxps_avx(auVar116,auVar126);
        auVar116 = vandps_avx(ZEXT1632(auVar151),local_2c0);
        auVar116 = vmaxps_avx(auVar126,auVar116);
        auVar126 = vcmpps_avx(auVar116,auVar140,1);
        auVar116 = vblendvps_avx(ZEXT1632(auVar22),auVar25,auVar126);
        auVar126 = vblendvps_avx(ZEXT1632(auVar114),auVar164,auVar126);
        auVar22 = vfmadd213ps_fma(auVar143,local_5c0,ZEXT1632(auVar9));
        auVar9 = vfmadd213ps_fma(auVar124,auVar124,ZEXT832(0) << 0x20);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar217,auVar217);
        auVar143 = vrsqrtps_avx(ZEXT1632(auVar9));
        fVar150 = auVar143._0_4_;
        fVar127 = auVar143._4_4_;
        fVar128 = auVar143._8_4_;
        fVar129 = auVar143._12_4_;
        fVar130 = auVar143._16_4_;
        fVar131 = auVar143._20_4_;
        fVar132 = auVar143._24_4_;
        auVar39._4_4_ = fVar127 * fVar127 * fVar127 * auVar9._4_4_ * -0.5;
        auVar39._0_4_ = fVar150 * fVar150 * fVar150 * auVar9._0_4_ * -0.5;
        auVar39._8_4_ = fVar128 * fVar128 * fVar128 * auVar9._8_4_ * -0.5;
        auVar39._12_4_ = fVar129 * fVar129 * fVar129 * auVar9._12_4_ * -0.5;
        auVar39._16_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar39._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar39._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar39._28_4_ = 0;
        auVar223._8_4_ = 0x3fc00000;
        auVar223._0_8_ = 0x3fc000003fc00000;
        auVar223._12_4_ = 0x3fc00000;
        auVar223._16_4_ = 0x3fc00000;
        auVar223._20_4_ = 0x3fc00000;
        auVar223._24_4_ = 0x3fc00000;
        auVar223._28_4_ = 0x3fc00000;
        auVar9 = vfmadd231ps_fma(auVar39,auVar223,auVar143);
        fVar150 = auVar9._0_4_;
        fVar127 = auVar9._4_4_;
        auVar40._4_4_ = auVar217._4_4_ * fVar127;
        auVar40._0_4_ = auVar217._0_4_ * fVar150;
        fVar128 = auVar9._8_4_;
        auVar40._8_4_ = auVar217._8_4_ * fVar128;
        fVar129 = auVar9._12_4_;
        auVar40._12_4_ = auVar217._12_4_ * fVar129;
        auVar40._16_4_ = auVar217._16_4_ * 0.0;
        auVar40._20_4_ = auVar217._20_4_ * 0.0;
        auVar40._24_4_ = auVar217._24_4_ * 0.0;
        auVar40._28_4_ = auVar143._28_4_;
        auVar41._4_4_ = -auVar124._4_4_ * fVar127;
        auVar41._0_4_ = -auVar124._0_4_ * fVar150;
        auVar41._8_4_ = -auVar124._8_4_ * fVar128;
        auVar41._12_4_ = -auVar124._12_4_ * fVar129;
        auVar41._16_4_ = -auVar124._16_4_ * 0.0;
        auVar41._20_4_ = -auVar124._20_4_ * 0.0;
        auVar41._24_4_ = -auVar124._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar9 = vfmadd213ps_fma(auVar116,auVar116,ZEXT832(0) << 0x20);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar126,auVar126);
        auVar124 = vrsqrtps_avx(ZEXT1632(auVar9));
        auVar143 = ZEXT1632(CONCAT412(fVar129 * 0.0,
                                      CONCAT48(fVar128 * 0.0,CONCAT44(fVar127 * 0.0,fVar150 * 0.0)))
                           );
        fVar150 = auVar124._0_4_;
        fVar127 = auVar124._4_4_;
        fVar128 = auVar124._8_4_;
        fVar129 = auVar124._12_4_;
        fVar130 = auVar124._16_4_;
        fVar131 = auVar124._20_4_;
        fVar132 = auVar124._24_4_;
        auVar42._4_4_ = fVar127 * fVar127 * fVar127 * auVar9._4_4_ * -0.5;
        auVar42._0_4_ = fVar150 * fVar150 * fVar150 * auVar9._0_4_ * -0.5;
        auVar42._8_4_ = fVar128 * fVar128 * fVar128 * auVar9._8_4_ * -0.5;
        auVar42._12_4_ = fVar129 * fVar129 * fVar129 * auVar9._12_4_ * -0.5;
        auVar42._16_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar42._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar42._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar42._28_4_ = 0xbf000000;
        auVar9 = vfmadd231ps_fma(auVar42,auVar223,auVar124);
        fVar150 = auVar9._0_4_;
        fVar127 = auVar9._4_4_;
        auVar43._4_4_ = fVar127 * auVar126._4_4_;
        auVar43._0_4_ = fVar150 * auVar126._0_4_;
        fVar128 = auVar9._8_4_;
        auVar43._8_4_ = fVar128 * auVar126._8_4_;
        fVar129 = auVar9._12_4_;
        auVar43._12_4_ = fVar129 * auVar126._12_4_;
        auVar43._16_4_ = auVar126._16_4_ * 0.0;
        auVar43._20_4_ = auVar126._20_4_ * 0.0;
        auVar43._24_4_ = auVar126._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = fVar127 * -auVar116._4_4_;
        auVar44._0_4_ = fVar150 * -auVar116._0_4_;
        auVar44._8_4_ = fVar128 * -auVar116._8_4_;
        auVar44._12_4_ = fVar129 * -auVar116._12_4_;
        auVar44._16_4_ = -auVar116._16_4_ * 0.0;
        auVar44._20_4_ = -auVar116._20_4_ * 0.0;
        auVar44._24_4_ = -auVar116._24_4_ * 0.0;
        auVar44._28_4_ = 0x3fc00000;
        auVar45._28_4_ = auVar124._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(fVar129 * 0.0,
                                CONCAT48(fVar128 * 0.0,CONCAT44(fVar127 * 0.0,fVar150 * 0.0))));
        auVar9 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar7),auVar138);
        auVar116 = ZEXT1632(auVar7);
        auVar11 = vfmadd213ps_fma(auVar41,auVar116,auVar187);
        auVar12 = vfmadd213ps_fma(auVar143,auVar116,ZEXT1632(auVar22));
        auVar151 = vfnmadd213ps_fma(auVar40,auVar116,auVar138);
        auVar13 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar8),auVar117);
        auVar27 = vfnmadd213ps_fma(auVar41,auVar116,auVar187);
        auVar116 = ZEXT1632(auVar8);
        auVar114 = vfmadd213ps_fma(auVar44,auVar116,auVar161);
        auVar199 = ZEXT1632(auVar7);
        auVar135 = vfnmadd231ps_fma(ZEXT1632(auVar22),auVar199,auVar143);
        auVar22 = vfmadd213ps_fma(auVar45,auVar116,ZEXT1632(auVar21));
        auVar115 = vfnmadd213ps_fma(auVar43,auVar116,auVar117);
        auVar134 = vfnmadd213ps_fma(auVar44,auVar116,auVar161);
        auVar152 = vfnmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar8),auVar45);
        auVar116 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar27));
        auVar126 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar135));
        auVar162._0_4_ = auVar135._0_4_ * auVar116._0_4_;
        auVar162._4_4_ = auVar135._4_4_ * auVar116._4_4_;
        auVar162._8_4_ = auVar135._8_4_ * auVar116._8_4_;
        auVar162._12_4_ = auVar135._12_4_ * auVar116._12_4_;
        auVar162._16_4_ = auVar116._16_4_ * 0.0;
        auVar162._20_4_ = auVar116._20_4_ * 0.0;
        auVar162._24_4_ = auVar116._24_4_ * 0.0;
        auVar162._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar162,ZEXT1632(auVar27),auVar126);
        auVar46._4_4_ = auVar151._4_4_ * auVar126._4_4_;
        auVar46._0_4_ = auVar151._0_4_ * auVar126._0_4_;
        auVar46._8_4_ = auVar151._8_4_ * auVar126._8_4_;
        auVar46._12_4_ = auVar151._12_4_ * auVar126._12_4_;
        auVar46._16_4_ = auVar126._16_4_ * 0.0;
        auVar46._20_4_ = auVar126._20_4_ * 0.0;
        auVar46._24_4_ = auVar126._24_4_ * 0.0;
        auVar46._28_4_ = auVar126._28_4_;
        auVar201 = ZEXT1632(auVar151);
        auVar126 = vsubps_avx(ZEXT1632(auVar13),auVar201);
        auVar21 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar135),auVar126);
        auVar47._4_4_ = auVar27._4_4_ * auVar126._4_4_;
        auVar47._0_4_ = auVar27._0_4_ * auVar126._0_4_;
        auVar47._8_4_ = auVar27._8_4_ * auVar126._8_4_;
        auVar47._12_4_ = auVar27._12_4_ * auVar126._12_4_;
        auVar47._16_4_ = auVar126._16_4_ * 0.0;
        auVar47._20_4_ = auVar126._20_4_ * 0.0;
        auVar47._24_4_ = auVar126._24_4_ * 0.0;
        auVar47._28_4_ = auVar126._28_4_;
        auVar151 = vfmsub231ps_fma(auVar47,auVar201,auVar116);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar151),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar117 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
        auVar178 = ZEXT3264(auVar117);
        auVar116 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar9),auVar117);
        auVar126 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar11),auVar117);
        auVar124 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar12),auVar117);
        auVar143 = vblendvps_avx(auVar201,ZEXT1632(auVar13),auVar117);
        auVar217 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar114),auVar117);
        auVar23 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar22),auVar117);
        auVar201 = vblendvps_avx(ZEXT1632(auVar13),auVar201,auVar117);
        auVar24 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar27),auVar117);
        auVar21 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar136 = vblendvps_avx(ZEXT1632(auVar22),ZEXT1632(auVar135),auVar117);
        auVar138 = vsubps_avx(auVar201,auVar116);
        auVar24 = vsubps_avx(auVar24,auVar126);
        auVar161 = vsubps_avx(auVar136,auVar124);
        auVar187 = vsubps_avx(auVar116,auVar143);
        auVar196 = vsubps_avx(auVar126,auVar217);
        auVar198 = vsubps_avx(auVar124,auVar23);
        auVar48._4_4_ = auVar161._4_4_ * auVar116._4_4_;
        auVar48._0_4_ = auVar161._0_4_ * auVar116._0_4_;
        auVar48._8_4_ = auVar161._8_4_ * auVar116._8_4_;
        auVar48._12_4_ = auVar161._12_4_ * auVar116._12_4_;
        auVar48._16_4_ = auVar161._16_4_ * auVar116._16_4_;
        auVar48._20_4_ = auVar161._20_4_ * auVar116._20_4_;
        auVar48._24_4_ = auVar161._24_4_ * auVar116._24_4_;
        auVar48._28_4_ = auVar136._28_4_;
        auVar22 = vfmsub231ps_fma(auVar48,auVar124,auVar138);
        auVar49._4_4_ = auVar138._4_4_ * auVar126._4_4_;
        auVar49._0_4_ = auVar138._0_4_ * auVar126._0_4_;
        auVar49._8_4_ = auVar138._8_4_ * auVar126._8_4_;
        auVar49._12_4_ = auVar138._12_4_ * auVar126._12_4_;
        auVar49._16_4_ = auVar138._16_4_ * auVar126._16_4_;
        auVar49._20_4_ = auVar138._20_4_ * auVar126._20_4_;
        auVar49._24_4_ = auVar138._24_4_ * auVar126._24_4_;
        auVar49._28_4_ = auVar201._28_4_;
        auVar7 = vfmsub231ps_fma(auVar49,auVar116,auVar24);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar121._0_4_ = auVar24._0_4_ * auVar124._0_4_;
        auVar121._4_4_ = auVar24._4_4_ * auVar124._4_4_;
        auVar121._8_4_ = auVar24._8_4_ * auVar124._8_4_;
        auVar121._12_4_ = auVar24._12_4_ * auVar124._12_4_;
        auVar121._16_4_ = auVar24._16_4_ * auVar124._16_4_;
        auVar121._20_4_ = auVar24._20_4_ * auVar124._20_4_;
        auVar121._24_4_ = auVar24._24_4_ * auVar124._24_4_;
        auVar121._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar121,auVar126,auVar161);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar168 = ZEXT1664(auVar7);
        auVar122._0_4_ = auVar198._0_4_ * auVar143._0_4_;
        auVar122._4_4_ = auVar198._4_4_ * auVar143._4_4_;
        auVar122._8_4_ = auVar198._8_4_ * auVar143._8_4_;
        auVar122._12_4_ = auVar198._12_4_ * auVar143._12_4_;
        auVar122._16_4_ = auVar198._16_4_ * auVar143._16_4_;
        auVar122._20_4_ = auVar198._20_4_ * auVar143._20_4_;
        auVar122._24_4_ = auVar198._24_4_ * auVar143._24_4_;
        auVar122._28_4_ = 0;
        auVar22 = vfmsub231ps_fma(auVar122,auVar187,auVar23);
        auVar50._4_4_ = auVar196._4_4_ * auVar23._4_4_;
        auVar50._0_4_ = auVar196._0_4_ * auVar23._0_4_;
        auVar50._8_4_ = auVar196._8_4_ * auVar23._8_4_;
        auVar50._12_4_ = auVar196._12_4_ * auVar23._12_4_;
        auVar50._16_4_ = auVar196._16_4_ * auVar23._16_4_;
        auVar50._20_4_ = auVar196._20_4_ * auVar23._20_4_;
        auVar50._24_4_ = auVar196._24_4_ * auVar23._24_4_;
        auVar50._28_4_ = auVar23._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar217,auVar198);
        auVar51._4_4_ = auVar187._4_4_ * auVar217._4_4_;
        auVar51._0_4_ = auVar187._0_4_ * auVar217._0_4_;
        auVar51._8_4_ = auVar187._8_4_ * auVar217._8_4_;
        auVar51._12_4_ = auVar187._12_4_ * auVar217._12_4_;
        auVar51._16_4_ = auVar187._16_4_ * auVar217._16_4_;
        auVar51._20_4_ = auVar187._20_4_ * auVar217._20_4_;
        auVar51._24_4_ = auVar187._24_4_ * auVar217._24_4_;
        auVar51._28_4_ = auVar217._28_4_;
        auVar11 = vfmsub231ps_fma(auVar51,auVar196,auVar143);
        auVar217 = ZEXT832(0) << 0x20;
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar217,ZEXT1632(auVar22));
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar217,ZEXT1632(auVar9));
        auVar143 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar9));
        auVar143 = vcmpps_avx(auVar143,ZEXT832(0) << 0x20,2);
        auVar22 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
        auVar21 = vpand_avx(auVar21,auVar22);
        auVar143 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar143 >> 0x7f,0) == '\0') &&
              (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar143 >> 0xbf,0) == '\0') &&
            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar143[0x1f]) {
LAB_01999975:
          auVar197 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar192 = ZEXT3264(local_660);
          auVar209 = ZEXT3264(local_680);
        }
        else {
          auVar52._4_4_ = auVar24._4_4_ * auVar198._4_4_;
          auVar52._0_4_ = auVar24._0_4_ * auVar198._0_4_;
          auVar52._8_4_ = auVar24._8_4_ * auVar198._8_4_;
          auVar52._12_4_ = auVar24._12_4_ * auVar198._12_4_;
          auVar52._16_4_ = auVar24._16_4_ * auVar198._16_4_;
          auVar52._20_4_ = auVar24._20_4_ * auVar198._20_4_;
          auVar52._24_4_ = auVar24._24_4_ * auVar198._24_4_;
          auVar52._28_4_ = auVar143._28_4_;
          auVar13 = vfmsub231ps_fma(auVar52,auVar196,auVar161);
          auVar141._0_4_ = auVar187._0_4_ * auVar161._0_4_;
          auVar141._4_4_ = auVar187._4_4_ * auVar161._4_4_;
          auVar141._8_4_ = auVar187._8_4_ * auVar161._8_4_;
          auVar141._12_4_ = auVar187._12_4_ * auVar161._12_4_;
          auVar141._16_4_ = auVar187._16_4_ * auVar161._16_4_;
          auVar141._20_4_ = auVar187._20_4_ * auVar161._20_4_;
          auVar141._24_4_ = auVar187._24_4_ * auVar161._24_4_;
          auVar141._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar141,auVar138,auVar198);
          auVar53._4_4_ = auVar138._4_4_ * auVar196._4_4_;
          auVar53._0_4_ = auVar138._0_4_ * auVar196._0_4_;
          auVar53._8_4_ = auVar138._8_4_ * auVar196._8_4_;
          auVar53._12_4_ = auVar138._12_4_ * auVar196._12_4_;
          auVar53._16_4_ = auVar138._16_4_ * auVar196._16_4_;
          auVar53._20_4_ = auVar138._20_4_ * auVar196._20_4_;
          auVar53._24_4_ = auVar138._24_4_ * auVar196._24_4_;
          auVar53._28_4_ = auVar138._28_4_;
          auVar114 = vfmsub231ps_fma(auVar53,auVar187,auVar24);
          auVar22 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar114));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar13),auVar217);
          auVar143 = vrcpps_avx(ZEXT1632(auVar11));
          auVar213._8_4_ = 0x3f800000;
          auVar213._0_8_ = &DAT_3f8000003f800000;
          auVar213._12_4_ = 0x3f800000;
          auVar213._16_4_ = 0x3f800000;
          auVar213._20_4_ = 0x3f800000;
          auVar213._24_4_ = 0x3f800000;
          auVar213._28_4_ = 0x3f800000;
          auVar22 = vfnmadd213ps_fma(auVar143,ZEXT1632(auVar11),auVar213);
          auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar143,auVar143);
          auVar54._4_4_ = auVar114._4_4_ * auVar124._4_4_;
          auVar54._0_4_ = auVar114._0_4_ * auVar124._0_4_;
          auVar54._8_4_ = auVar114._8_4_ * auVar124._8_4_;
          auVar54._12_4_ = auVar114._12_4_ * auVar124._12_4_;
          auVar54._16_4_ = auVar124._16_4_ * 0.0;
          auVar54._20_4_ = auVar124._20_4_ * 0.0;
          auVar54._24_4_ = auVar124._24_4_ * 0.0;
          auVar54._28_4_ = auVar124._28_4_;
          auVar12 = vfmadd231ps_fma(auVar54,auVar126,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),auVar116);
          fVar150 = auVar22._0_4_;
          fVar127 = auVar22._4_4_;
          fVar128 = auVar22._8_4_;
          fVar129 = auVar22._12_4_;
          auVar55._28_4_ = auVar126._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar129 * auVar12._12_4_,
                                  CONCAT48(fVar128 * auVar12._8_4_,
                                           CONCAT44(fVar127 * auVar12._4_4_,fVar150 * auVar12._0_4_)
                                          )));
          auVar123._4_4_ = uVar106;
          auVar123._0_4_ = uVar106;
          auVar123._8_4_ = uVar106;
          auVar123._12_4_ = uVar106;
          auVar123._16_4_ = uVar106;
          auVar123._20_4_ = uVar106;
          auVar123._24_4_ = uVar106;
          auVar123._28_4_ = uVar106;
          uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar142._4_4_ = uVar112;
          auVar142._0_4_ = uVar112;
          auVar142._8_4_ = uVar112;
          auVar142._12_4_ = uVar112;
          auVar142._16_4_ = uVar112;
          auVar142._20_4_ = uVar112;
          auVar142._24_4_ = uVar112;
          auVar142._28_4_ = uVar112;
          auVar116 = vcmpps_avx(auVar123,auVar55,2);
          auVar126 = vcmpps_avx(auVar55,auVar142,2);
          auVar116 = vandps_avx(auVar126,auVar116);
          auVar22 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
          auVar21 = vpand_avx(auVar21,auVar22);
          auVar116 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar116 >> 0x7f,0) == '\0') &&
                (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0xbf,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar116[0x1f]) goto LAB_01999975;
          auVar116 = vcmpps_avx(auVar217,ZEXT1632(auVar11),4);
          auVar22 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
          auVar21 = vpand_avx(auVar21,auVar22);
          auVar116 = vpmovsxwd_avx2(auVar21);
          auVar197 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar192 = ZEXT3264(local_660);
          auVar209 = ZEXT3264(local_680);
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0x7f,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0xbf,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar116[0x1f] < '\0') {
            auVar124 = ZEXT1632(CONCAT412(fVar129 * auVar7._12_4_,
                                          CONCAT48(fVar128 * auVar7._8_4_,
                                                   CONCAT44(fVar127 * auVar7._4_4_,
                                                            fVar150 * auVar7._0_4_))));
            auVar143 = ZEXT1632(CONCAT412(fVar129 * auVar9._12_4_,
                                          CONCAT48(fVar128 * auVar9._8_4_,
                                                   CONCAT44(fVar127 * auVar9._4_4_,
                                                            fVar150 * auVar9._0_4_))));
            auVar183._8_4_ = 0x3f800000;
            auVar183._0_8_ = &DAT_3f8000003f800000;
            auVar183._12_4_ = 0x3f800000;
            auVar183._16_4_ = 0x3f800000;
            auVar183._20_4_ = 0x3f800000;
            auVar183._24_4_ = 0x3f800000;
            auVar183._28_4_ = 0x3f800000;
            auVar126 = vsubps_avx(auVar183,auVar124);
            auVar168 = ZEXT3264(auVar126);
            auVar126 = vblendvps_avx(auVar126,auVar124,auVar117);
            auVar192 = ZEXT3264(auVar126);
            auVar126 = vsubps_avx(auVar183,auVar143);
            local_4c0 = vblendvps_avx(auVar126,auVar143,auVar117);
            auVar197 = ZEXT3264(auVar116);
            auVar209 = ZEXT3264(auVar55);
          }
        }
        auVar224 = ZEXT3264(auVar175);
        local_660 = auVar192._0_32_;
        local_680 = auVar209._0_32_;
        auVar116 = auVar197._0_32_;
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar197 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar197 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar197[0x1f]) {
          bVar111 = false;
          auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(
                                                  fVar214,CONCAT412(fVar214,CONCAT48(fVar214,
                                                  CONCAT44(fVar214,fVar214))))))));
        }
        else {
          auVar126 = vsubps_avx(ZEXT1632(auVar8),auVar199);
          auVar21 = vfmadd213ps_fma(auVar126,local_660,auVar199);
          fVar150 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar150;
          auVar56._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar150;
          auVar56._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar150;
          auVar56._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar150;
          auVar56._16_4_ = fVar150 * 0.0;
          auVar56._20_4_ = fVar150 * 0.0;
          auVar56._24_4_ = fVar150 * 0.0;
          auVar56._28_4_ = 0;
          auVar126 = vcmpps_avx(local_680,auVar56,6);
          auVar124 = auVar116 & auVar126;
          auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(
                                                  fVar214,CONCAT412(fVar214,CONCAT48(fVar214,
                                                  CONCAT44(fVar214,fVar214))))))));
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            local_380 = vandps_avx(auVar126,auVar116);
            auVar144._8_4_ = 0xbf800000;
            auVar144._0_8_ = 0xbf800000bf800000;
            auVar144._12_4_ = 0xbf800000;
            auVar144._16_4_ = 0xbf800000;
            auVar144._20_4_ = 0xbf800000;
            auVar144._24_4_ = 0xbf800000;
            auVar144._28_4_ = 0xbf800000;
            auVar163._8_4_ = 0x40000000;
            auVar163._0_8_ = 0x4000000040000000;
            auVar163._12_4_ = 0x40000000;
            auVar163._16_4_ = 0x40000000;
            auVar163._20_4_ = 0x40000000;
            auVar163._24_4_ = 0x40000000;
            auVar163._28_4_ = 0x40000000;
            auVar21 = vfmadd213ps_fma(local_4c0,auVar163,auVar144);
            auVar178 = ZEXT1664(auVar21);
            local_420 = ZEXT1632(auVar21);
            local_3e0 = 0;
            local_3d0 = local_7d0;
            uStack_3c8 = uStack_7c8;
            local_3c0 = local_610._0_8_;
            uStack_3b8 = local_610._8_8_;
            local_3b0 = local_620._0_8_;
            uStack_3a8 = local_620._8_8_;
            auVar168 = ZEXT1664(local_600);
            local_4c0 = local_420;
            if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar111 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar150 = 1.0 / auVar119._0_4_;
                auVar168 = ZEXT3264(CONCAT428(fVar150,CONCAT424(fVar150,CONCAT420(fVar150,CONCAT416(
                                                  fVar150,CONCAT412(fVar150,CONCAT48(fVar150,
                                                  CONCAT44(fVar150,fVar150))))))));
                local_360[0] = fVar150 * (auVar192._0_4_ + 0.0);
                local_360[1] = fVar150 * (auVar192._4_4_ + 1.0);
                local_360[2] = fVar150 * (auVar192._8_4_ + 2.0);
                local_360[3] = fVar150 * (auVar192._12_4_ + 3.0);
                fStack_350 = fVar150 * (auVar192._16_4_ + 4.0);
                fStack_34c = fVar150 * (auVar192._20_4_ + 5.0);
                fStack_348 = fVar150 * (auVar192._24_4_ + 6.0);
                fStack_344 = auVar192._28_4_ + 7.0;
                local_4c0._0_8_ = auVar21._0_8_;
                local_4c0._8_8_ = auVar21._8_8_;
                local_340 = local_4c0._0_8_;
                uStack_338 = local_4c0._8_8_;
                uStack_330 = 0;
                uStack_328 = 0;
                local_320 = local_680;
                uVar106 = vmovmskps_avx(local_380);
                bVar111 = uVar106 != 0;
                auVar116 = local_680;
                auVar126 = local_660;
                if (bVar111) {
                  uVar104 = 0;
                  uVar108 = (ulong)(uVar106 & 0xff);
                  for (uVar107 = uVar108; (uVar107 & 1) == 0;
                      uVar107 = uVar107 >> 1 | 0x8000000000000000) {
                    uVar104 = uVar104 + 1;
                  }
                  local_6c0._4_4_ = uVar15;
                  local_6c0._0_4_ = uVar15;
                  local_6c0._8_4_ = uVar15;
                  local_6c0._12_4_ = uVar15;
                  local_6c0._16_4_ = uVar15;
                  local_6c0._20_4_ = uVar15;
                  local_6c0._24_4_ = uVar15;
                  local_6c0._28_4_ = uVar15;
                  local_6e0._0_4_ = local_6e0._4_4_;
                  local_6e0._8_4_ = local_6e0._4_4_;
                  local_6e0._12_4_ = local_6e0._4_4_;
                  auStack_6d0._0_4_ = local_6e0._4_4_;
                  auStack_6d0._4_4_ = local_6e0._4_4_;
                  auStack_6d0._8_4_ = local_6e0._4_4_;
                  auStack_6d0._12_4_ = local_6e0._4_4_;
                  _local_700 = ZEXT1632(local_610);
                  local_560._16_16_ = auVar164._16_16_;
                  local_560._0_16_ = local_620;
                  _auStack_710 = auVar25._16_16_;
                  _local_720 = local_600;
                  local_760 = uVar113;
                  uStack_758 = uVar113;
                  uStack_750 = uVar113;
                  uStack_748 = uVar113;
                  local_740 = auVar175;
                  local_440 = local_660;
                  local_400 = local_680;
                  local_3dc = iVar103;
                  local_3a0 = local_600;
                  do {
                    uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_240 = local_360[uVar104];
                    uVar4 = *(undefined4 *)((long)&local_340 + uVar104 * 4);
                    local_220._4_4_ = uVar4;
                    local_220._0_4_ = uVar4;
                    local_220._8_4_ = uVar4;
                    local_220._12_4_ = uVar4;
                    local_220._16_4_ = uVar4;
                    local_220._20_4_ = uVar4;
                    local_220._24_4_ = uVar4;
                    local_220._28_4_ = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar104 * 4);
                    fVar128 = 1.0 - local_240;
                    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128)),
                                              ZEXT416((uint)(local_240 * fVar128)),
                                              ZEXT416(0xc0000000));
                    auVar21 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar128)),
                                              ZEXT416((uint)(local_240 * local_240)),
                                              ZEXT416(0x40000000));
                    fVar150 = auVar21._0_4_ * 3.0;
                    fVar127 = local_240 * local_240 * 3.0;
                    auVar185._0_4_ = fVar127 * (float)local_720._0_4_;
                    auVar185._4_4_ = fVar127 * (float)local_720._4_4_;
                    auVar185._8_4_ = fVar127 * fStack_718;
                    auVar185._12_4_ = fVar127 * fStack_714;
                    auVar157._4_4_ = fVar150;
                    auVar157._0_4_ = fVar150;
                    auVar157._8_4_ = fVar150;
                    auVar157._12_4_ = fVar150;
                    auVar21 = vfmadd132ps_fma(auVar157,auVar185,local_560._0_16_);
                    fVar150 = auVar22._0_4_ * 3.0;
                    auVar181._4_4_ = fVar150;
                    auVar181._0_4_ = fVar150;
                    auVar181._8_4_ = fVar150;
                    auVar181._12_4_ = fVar150;
                    auVar21 = vfmadd132ps_fma(auVar181,auVar21,_local_700);
                    fVar150 = fVar128 * fVar128 * -3.0;
                    local_7b0.context = context->user;
                    auVar158._4_4_ = fVar150;
                    auVar158._0_4_ = fVar150;
                    auVar158._8_4_ = fVar150;
                    auVar158._12_4_ = fVar150;
                    auVar22 = vfmadd132ps_fma(auVar158,auVar21,auVar10);
                    local_2a0 = auVar22._0_4_;
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    auVar21 = vmovshdup_avx(auVar22);
                    auVar173._0_8_ = auVar21._0_8_;
                    auVar173._8_8_ = auVar173._0_8_;
                    local_280._16_8_ = auVar173._0_8_;
                    local_280._0_16_ = auVar173;
                    local_280._24_8_ = auVar173._0_8_;
                    auVar178 = ZEXT3264(local_280);
                    auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
                    auVar159._0_8_ = auVar21._0_8_;
                    auVar159._8_8_ = auVar159._0_8_;
                    local_260._16_8_ = auVar159._0_8_;
                    local_260._0_16_ = auVar159;
                    local_260._24_8_ = auVar159._0_8_;
                    auVar168 = ZEXT3264(local_260);
                    fStack_23c = local_240;
                    fStack_238 = local_240;
                    fStack_234 = local_240;
                    fStack_230 = local_240;
                    fStack_22c = local_240;
                    fStack_228 = local_240;
                    fStack_224 = local_240;
                    local_200 = local_6e0._0_8_;
                    uStack_1f8 = local_6e0._8_8_;
                    uStack_1f0 = auStack_6d0._0_8_;
                    uStack_1e8 = auStack_6d0._8_8_;
                    local_1e0 = local_6c0;
                    auVar116 = vpcmpeqd_avx2(local_220,local_220);
                    local_1c0 = (local_7b0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7b0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_640 = local_2e0._0_8_;
                    uStack_638 = local_2e0._8_8_;
                    uStack_630 = local_2e0._16_8_;
                    uStack_628 = local_2e0._24_8_;
                    local_7b0.valid = (int *)&local_640;
                    local_7b0.geometryUserPtr = pGVar16->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_2a0;
                    local_7b0.N = 8;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar168 = ZEXT1664(auVar159);
                      auVar178 = ZEXT1664(auVar173);
                      (*pGVar16->occlusionFilterN)(&local_7b0);
                      auVar147._8_56_ = extraout_var;
                      auVar147._0_8_ = extraout_XMM1_Qa;
                      auVar224 = ZEXT3264(local_740);
                      auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,
                                                  CONCAT416(fVar214,CONCAT412(fVar214,CONCAT48(
                                                  fVar214,CONCAT44(fVar214,fVar214))))))));
                      auVar209 = ZEXT3264(local_680);
                      auVar192 = ZEXT3264(local_660);
                      auVar116 = vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                      uVar113 = local_760;
                      uVar220 = uStack_758;
                      uVar221 = uStack_750;
                      uVar222 = uStack_748;
                    }
                    auVar94._8_8_ = uStack_638;
                    auVar94._0_8_ = local_640;
                    auVar94._16_8_ = uStack_630;
                    auVar94._24_8_ = uStack_628;
                    auVar124 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
                    auVar126 = auVar116 & ~auVar124;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar126 >> 0x7f,0) == '\0') &&
                          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0xbf,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar126[0x1f]) {
                      auVar124 = auVar124 ^ auVar116;
                    }
                    else {
                      p_Var20 = context->args->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar178 = ZEXT1664(auVar178._0_16_);
                        (*p_Var20)(&local_7b0);
                        auVar224 = ZEXT3264(local_740);
                        auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,
                                                  CONCAT416(fVar214,CONCAT412(fVar214,CONCAT48(
                                                  fVar214,CONCAT44(fVar214,fVar214))))))));
                        auVar209 = ZEXT3264(local_680);
                        auVar192 = ZEXT3264(local_660);
                        uVar113 = local_760;
                        uVar220 = uStack_758;
                        uVar221 = uStack_750;
                        uVar222 = uStack_748;
                      }
                      auVar95._8_8_ = uStack_638;
                      auVar95._0_8_ = local_640;
                      auVar95._16_8_ = uStack_630;
                      auVar95._24_8_ = uStack_628;
                      auVar126 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      auVar116 = vpcmpeqd_avx2(auVar126,auVar95);
                      auVar124 = vpcmpeqd_avx2(auVar126,auVar126);
                      auVar124 = auVar116 ^ auVar124;
                      auVar167._8_4_ = 0xff800000;
                      auVar167._0_8_ = 0xff800000ff800000;
                      auVar167._12_4_ = 0xff800000;
                      auVar167._16_4_ = 0xff800000;
                      auVar167._20_4_ = 0xff800000;
                      auVar167._24_4_ = 0xff800000;
                      auVar167._28_4_ = 0xff800000;
                      auVar168 = ZEXT3264(auVar167);
                      auVar116 = vblendvps_avx(auVar167,*(undefined1 (*) [32])
                                                         (local_7b0.ray + 0x100),auVar116);
                      *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar116;
                    }
                    auVar175 = auVar224._0_32_;
                    auVar116 = auVar209._0_32_;
                    auVar126 = auVar192._0_32_;
                    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar124 >> 0x7f,0) != '\0') ||
                          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar124 >> 0xbf,0) != '\0') ||
                        (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar124[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                    uVar107 = uVar104 & 0x3f;
                    uVar104 = 0;
                    uVar108 = uVar108 ^ 1L << uVar107;
                    for (uVar107 = uVar108; (uVar107 & 1) == 0;
                        uVar107 = uVar107 >> 1 | 0x8000000000000000) {
                      uVar104 = uVar104 + 1;
                    }
                    bVar111 = uVar108 != 0;
                  } while (bVar111);
                }
                local_660 = auVar126;
                local_680 = auVar116;
                uVar106 = local_780._0_4_;
              }
              goto LAB_01998ac9;
            }
          }
          bVar111 = false;
        }
      }
LAB_01998ac9:
      local_780._0_4_ = uVar106;
      auVar209 = ZEXT3264(auVar212);
      if (8 < iVar103) {
        local_720._4_4_ = iVar103;
        local_720._0_4_ = iVar103;
        fStack_718 = (float)iVar103;
        fStack_714 = (float)iVar103;
        auStack_710._0_4_ = iVar103;
        auStack_710._4_4_ = iVar103;
        fStack_708 = (float)iVar103;
        iStack_704 = iVar103;
        local_100 = fVar149;
        fStack_fc = fVar149;
        fStack_f8 = fVar149;
        fStack_f4 = fVar149;
        fStack_f0 = fVar149;
        fStack_ec = fVar149;
        fStack_e8 = fVar149;
        fStack_e4 = fVar149;
        local_120 = local_780._0_4_;
        uStack_11c = local_780._0_4_;
        uStack_118 = local_780._0_4_;
        uStack_114 = local_780._0_4_;
        uStack_110 = local_780._0_4_;
        uStack_10c = local_780._0_4_;
        uStack_108 = local_780._0_4_;
        uStack_104 = local_780._0_4_;
        local_180 = 1.0 / (float)local_580._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_140 = uVar15;
        uStack_13c = uVar15;
        uStack_138 = uVar15;
        uStack_134 = uVar15;
        uStack_130 = uVar15;
        uStack_12c = uVar15;
        uStack_128 = uVar15;
        uStack_124 = uVar15;
        local_160 = local_5a0._0_4_;
        uStack_15c = local_5a0._0_4_;
        uStack_158 = local_5a0._0_4_;
        uStack_154 = local_5a0._0_4_;
        uStack_150 = local_5a0._0_4_;
        uStack_14c = local_5a0._0_4_;
        uStack_148 = local_5a0._0_4_;
        uStack_144 = local_5a0._0_4_;
        lVar109 = 8;
        auVar192 = ZEXT3264(local_6a0);
        local_760 = uVar113;
        uStack_758 = uVar220;
        uStack_750 = uVar221;
        uStack_748 = uVar222;
        local_740 = auVar175;
        do {
          auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar109 * 4 + lVar26);
          auVar126 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + lVar109 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + lVar109 * 4);
          pauVar2 = (undefined1 (*) [16])(lVar26 + 0x2228070 + lVar109 * 4);
          auVar100 = *(undefined1 (*) [12])*pauVar2;
          fVar132 = *(float *)(*pauVar2 + 0xc);
          fStack_770 = *(float *)pauVar2[1];
          fStack_76c = *(float *)(pauVar2[1] + 4);
          fStack_768 = *(float *)(pauVar2[1] + 8);
          uStack_764 = *(undefined4 *)(pauVar2[1] + 0xc);
          auVar179._0_4_ = auVar197._0_4_ * *(float *)*pauVar2;
          auVar179._4_4_ = auVar197._4_4_ * *(float *)(*pauVar2 + 4);
          auVar179._8_4_ = auVar197._8_4_ * *(float *)(*pauVar2 + 8);
          auVar179._12_4_ = auVar197._12_4_ * fVar132;
          auVar179._16_4_ = auVar197._16_4_ * fStack_770;
          auVar179._20_4_ = auVar197._20_4_ * fStack_76c;
          auVar179._28_36_ = auVar178._28_36_;
          auVar179._24_4_ = auVar197._24_4_ * fStack_768;
          auVar224._0_4_ = fVar225 * *(float *)*pauVar2;
          auVar224._4_4_ = fVar228 * *(float *)(*pauVar2 + 4);
          auVar224._8_4_ = fVar225 * *(float *)(*pauVar2 + 8);
          auVar224._12_4_ = fVar228 * fVar132;
          auVar224._16_4_ = fVar225 * fStack_770;
          auVar224._20_4_ = fVar228 * fStack_76c;
          auVar224._28_36_ = auVar168._28_36_;
          auVar224._24_4_ = fVar225 * fStack_768;
          auVar21 = vfmadd231ps_fma(auVar179._0_32_,auVar124,auVar160);
          auVar198 = auVar209._0_32_;
          auVar22 = vfmadd231ps_fma(auVar224._0_32_,auVar124,auVar198);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar126,auVar182);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar126,auVar192._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar116,auVar174);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar116,local_540);
          auVar143 = *(undefined1 (*) [32])(bezier_basis1 + lVar109 * 4 + lVar26);
          auVar217 = *(undefined1 (*) [32])(lVar26 + 0x2229b88 + lVar109 * 4);
          auVar23 = *(undefined1 (*) [32])(lVar26 + 0x222a00c + lVar109 * 4);
          pfVar1 = (float *)(lVar26 + 0x222a490 + lVar109 * 4);
          fVar215 = *pfVar1;
          fVar219 = pfVar1[1];
          fVar88 = pfVar1[2];
          fVar89 = pfVar1[3];
          fVar90 = pfVar1[4];
          fVar91 = pfVar1[5];
          fVar133 = pfVar1[6];
          auVar57._4_4_ = fVar219 * auVar197._4_4_;
          auVar57._0_4_ = fVar215 * auVar197._0_4_;
          auVar57._8_4_ = fVar88 * auVar197._8_4_;
          auVar57._12_4_ = fVar89 * auVar197._12_4_;
          auVar57._16_4_ = fVar90 * auVar197._16_4_;
          auVar57._20_4_ = fVar91 * auVar197._20_4_;
          auVar57._24_4_ = fVar133 * auVar197._24_4_;
          auVar57._28_4_ = auVar116._28_4_;
          auVar209._0_4_ = fVar215 * fVar225;
          auVar209._4_4_ = fVar219 * fVar228;
          auVar209._8_4_ = fVar88 * fVar225;
          auVar209._12_4_ = fVar89 * fVar228;
          auVar209._16_4_ = fVar90 * fVar225;
          auVar209._20_4_ = fVar91 * fVar228;
          auVar209._28_36_ = auVar197._28_36_;
          auVar209._24_4_ = fVar133 * fVar225;
          auVar7 = vfmadd231ps_fma(auVar57,auVar23,auVar160);
          auVar8 = vfmadd231ps_fma(auVar209._0_32_,auVar23,auVar198);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar217,auVar182);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar217,auVar192._0_32_);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar143,auVar174);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar143,local_540);
          local_560 = ZEXT1632(auVar7);
          auVar161 = ZEXT1632(auVar21);
          auVar24 = vsubps_avx(local_560,auVar161);
          auVar187 = ZEXT1632(auVar8);
          auVar138 = ZEXT1632(auVar22);
          auVar25 = vsubps_avx(auVar187,auVar138);
          auVar58._4_4_ = auVar22._4_4_ * auVar24._4_4_;
          auVar58._0_4_ = auVar22._0_4_ * auVar24._0_4_;
          auVar58._8_4_ = auVar22._8_4_ * auVar24._8_4_;
          auVar58._12_4_ = auVar22._12_4_ * auVar24._12_4_;
          auVar58._16_4_ = auVar24._16_4_ * 0.0;
          auVar58._20_4_ = auVar24._20_4_ * 0.0;
          auVar58._24_4_ = auVar24._24_4_ * 0.0;
          auVar58._28_4_ = auVar192._28_4_;
          fVar149 = auVar25._0_4_;
          fVar150 = auVar25._4_4_;
          auVar101._4_4_ = auVar21._4_4_ * fVar150;
          auVar101._0_4_ = auVar21._0_4_ * fVar149;
          fVar127 = auVar25._8_4_;
          auVar101._8_4_ = auVar21._8_4_ * fVar127;
          fVar128 = auVar25._12_4_;
          auVar101._12_4_ = auVar21._12_4_ * fVar128;
          fVar129 = auVar25._16_4_;
          auVar101._16_4_ = fVar129 * 0.0;
          fVar130 = auVar25._20_4_;
          auVar101._20_4_ = fVar130 * 0.0;
          fVar131 = auVar25._24_4_;
          auVar101._24_4_ = fVar131 * 0.0;
          auVar101._28_4_ = uVar210;
          auVar164 = vsubps_avx(auVar58,auVar101);
          local_780._0_4_ = auVar100._0_4_;
          local_780._4_4_ = auVar100._4_4_;
          uStack_778._0_4_ = auVar100._8_4_;
          auVar59._4_4_ = local_e0._4_4_ * (float)local_780._4_4_;
          auVar59._0_4_ = (float)local_e0 * (float)local_780._0_4_;
          auVar59._8_4_ = (float)uStack_d8 * (float)uStack_778;
          auVar59._12_4_ = uStack_d8._4_4_ * fVar132;
          auVar59._16_4_ = (float)uStack_d0 * fStack_770;
          auVar59._20_4_ = uStack_d0._4_4_ * fStack_76c;
          auVar59._24_4_ = (float)uStack_c8 * fStack_768;
          auVar59._28_4_ = uVar210;
          auVar21 = vfmadd231ps_fma(auVar59,local_c0,auVar124);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_740,auVar126);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,auVar116);
          auVar60._4_4_ = local_e0._4_4_ * fVar219;
          auVar60._0_4_ = (float)local_e0 * fVar215;
          auVar60._8_4_ = (float)uStack_d8 * fVar88;
          auVar60._12_4_ = uStack_d8._4_4_ * fVar89;
          auVar60._16_4_ = (float)uStack_d0 * fVar90;
          auVar60._20_4_ = uStack_d0._4_4_ * fVar91;
          auVar60._24_4_ = (float)uStack_c8 * fVar133;
          auVar60._28_4_ = uStack_c8._4_4_;
          auVar22 = vfmadd231ps_fma(auVar60,auVar23,local_c0);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar217,local_740);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar143,local_a0);
          auVar196 = ZEXT1632(auVar22);
          auVar168 = ZEXT3264(auVar196);
          auVar192 = ZEXT3264(local_6a0);
          auVar205._0_4_ = fVar149 * fVar149;
          auVar205._4_4_ = fVar150 * fVar150;
          auVar205._8_4_ = fVar127 * fVar127;
          auVar205._12_4_ = fVar128 * fVar128;
          auVar205._16_4_ = fVar129 * fVar129;
          auVar205._20_4_ = fVar130 * fVar130;
          auVar205._24_4_ = fVar131 * fVar131;
          auVar205._28_4_ = 0;
          auVar22 = vfmadd231ps_fma(auVar205,auVar24,auVar24);
          auVar117 = ZEXT1632(auVar21);
          auVar201 = vmaxps_avx(auVar117,auVar196);
          auVar206._0_4_ = auVar201._0_4_ * auVar201._0_4_ * auVar22._0_4_;
          auVar206._4_4_ = auVar201._4_4_ * auVar201._4_4_ * auVar22._4_4_;
          auVar206._8_4_ = auVar201._8_4_ * auVar201._8_4_ * auVar22._8_4_;
          auVar206._12_4_ = auVar201._12_4_ * auVar201._12_4_ * auVar22._12_4_;
          auVar206._16_4_ = auVar201._16_4_ * auVar201._16_4_ * 0.0;
          auVar206._20_4_ = auVar201._20_4_ * auVar201._20_4_ * 0.0;
          auVar206._24_4_ = auVar201._24_4_ * auVar201._24_4_ * 0.0;
          auVar206._28_4_ = 0;
          auVar61._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar61._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar61._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar61._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar61._16_4_ = auVar164._16_4_ * auVar164._16_4_;
          auVar61._20_4_ = auVar164._20_4_ * auVar164._20_4_;
          auVar61._24_4_ = auVar164._24_4_ * auVar164._24_4_;
          auVar61._28_4_ = auVar164._28_4_;
          auVar201 = vcmpps_avx(auVar61,auVar206,2);
          auVar178 = ZEXT3264(auVar201);
          local_3e0 = (int)lVar109;
          auVar207._4_4_ = local_3e0;
          auVar207._0_4_ = local_3e0;
          auVar207._8_4_ = local_3e0;
          auVar207._12_4_ = local_3e0;
          auVar207._16_4_ = local_3e0;
          auVar207._20_4_ = local_3e0;
          auVar207._24_4_ = local_3e0;
          auVar207._28_4_ = local_3e0;
          auVar164 = vpor_avx2(auVar207,_DAT_0205a920);
          auVar136 = vpcmpgtd_avx2(_local_720,auVar164);
          auVar164 = auVar136 & auVar201;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar164[0x1f]) {
            auVar209 = ZEXT3264(auVar198);
            auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(
                                                  fVar214,CONCAT412(fVar214,CONCAT48(fVar214,
                                                  CONCAT44(fVar214,fVar214))))))));
          }
          else {
            local_4a0 = vandps_avx(auVar136,auVar201);
            auVar62._4_4_ = local_760._4_4_ * fVar219;
            auVar62._0_4_ = (float)local_760 * fVar215;
            auVar62._8_4_ = (float)uStack_758 * fVar88;
            auVar62._12_4_ = uStack_758._4_4_ * fVar89;
            auVar62._16_4_ = (float)uStack_750 * fVar90;
            auVar62._20_4_ = uStack_750._4_4_ * fVar91;
            auVar62._24_4_ = (float)uStack_748 * fVar133;
            auVar62._28_4_ = auVar201._28_4_;
            auVar21 = vfmadd213ps_fma(auVar23,local_480,auVar62);
            auVar21 = vfmadd213ps_fma(auVar217,local_520,ZEXT1632(auVar21));
            auVar21 = vfmadd132ps_fma(auVar143,ZEXT1632(auVar21),local_5c0);
            auVar63._4_4_ = local_760._4_4_ * (float)local_780._4_4_;
            auVar63._0_4_ = (float)local_760 * (float)local_780._0_4_;
            auVar63._8_4_ = (float)uStack_758 * (float)uStack_778;
            auVar63._12_4_ = uStack_758._4_4_ * fVar132;
            auVar63._16_4_ = (float)uStack_750 * fStack_770;
            auVar63._20_4_ = uStack_750._4_4_ * fStack_76c;
            auVar63._24_4_ = (float)uStack_748 * fStack_768;
            auVar63._28_4_ = auVar201._28_4_;
            auVar22 = vfmadd213ps_fma(auVar124,local_480,auVar63);
            auVar22 = vfmadd213ps_fma(auVar126,local_520,ZEXT1632(auVar22));
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x22284f4 + lVar109 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2228978 + lVar109 * 4);
            auVar143 = *(undefined1 (*) [32])(lVar26 + 0x2228dfc + lVar109 * 4);
            pfVar3 = (float *)(lVar26 + 0x2229280 + lVar109 * 4);
            fVar149 = *pfVar3;
            fVar150 = pfVar3[1];
            fVar127 = pfVar3[2];
            fVar128 = pfVar3[3];
            fVar129 = pfVar3[4];
            fVar130 = pfVar3[5];
            fVar131 = pfVar3[6];
            auVar64._4_4_ = fVar150 * fVar214;
            auVar64._0_4_ = fVar149 * fVar214;
            auVar64._8_4_ = fVar127 * fVar214;
            auVar64._12_4_ = fVar128 * fVar214;
            auVar64._16_4_ = fVar129 * fVar214;
            auVar64._20_4_ = fVar130 * fVar214;
            auVar64._24_4_ = fVar131 * fVar214;
            auVar64._28_4_ = local_540._28_4_;
            auVar65._4_4_ = fVar228 * fVar150;
            auVar65._0_4_ = fVar225 * fVar149;
            auVar65._8_4_ = fVar225 * fVar127;
            auVar65._12_4_ = fVar228 * fVar128;
            auVar65._16_4_ = fVar225 * fVar129;
            auVar65._20_4_ = fVar228 * fVar130;
            auVar65._24_4_ = fVar225 * fVar131;
            auVar65._28_4_ = pfVar1[7];
            auVar66._4_4_ = local_760._4_4_ * fVar150;
            auVar66._0_4_ = (float)local_760 * fVar149;
            auVar66._8_4_ = (float)uStack_758 * fVar127;
            auVar66._12_4_ = uStack_758._4_4_ * fVar128;
            auVar66._16_4_ = (float)uStack_750 * fVar129;
            auVar66._20_4_ = uStack_750._4_4_ * fVar130;
            auVar66._24_4_ = (float)uStack_748 * fVar131;
            auVar66._28_4_ = pfVar3[7];
            auVar7 = vfmadd231ps_fma(auVar64,auVar143,auVar160);
            auVar8 = vfmadd231ps_fma(auVar65,auVar143,auVar198);
            auVar9 = vfmadd231ps_fma(auVar66,local_480,auVar143);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar124,auVar182);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar124,local_6a0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_520,auVar124);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar126,auVar174);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar126,local_540);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar126,local_5c0);
            pfVar1 = (float *)(lVar26 + 0x222b6a0 + lVar109 * 4);
            fVar149 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar127 = pfVar1[2];
            fVar128 = pfVar1[3];
            fVar129 = pfVar1[4];
            fVar130 = pfVar1[5];
            fVar131 = pfVar1[6];
            auVar67._4_4_ = fVar214 * fVar150;
            auVar67._0_4_ = fVar214 * fVar149;
            auVar67._8_4_ = fVar214 * fVar127;
            auVar67._12_4_ = fVar214 * fVar128;
            auVar67._16_4_ = fVar214 * fVar129;
            auVar67._20_4_ = fVar214 * fVar130;
            auVar67._24_4_ = fVar214 * fVar131;
            auVar67._28_4_ = local_540._28_4_;
            auVar68._4_4_ = fVar228 * fVar150;
            auVar68._0_4_ = fVar225 * fVar149;
            auVar68._8_4_ = fVar225 * fVar127;
            auVar68._12_4_ = fVar228 * fVar128;
            auVar68._16_4_ = fVar225 * fVar129;
            auVar68._20_4_ = fVar228 * fVar130;
            auVar68._24_4_ = fVar225 * fVar131;
            auVar68._28_4_ = fVar228;
            auVar69._4_4_ = local_760._4_4_ * fVar150;
            auVar69._0_4_ = (float)local_760 * fVar149;
            auVar69._8_4_ = (float)uStack_758 * fVar127;
            auVar69._12_4_ = uStack_758._4_4_ * fVar128;
            auVar69._16_4_ = (float)uStack_750 * fVar129;
            auVar69._20_4_ = uStack_750._4_4_ * fVar130;
            auVar69._24_4_ = (float)uStack_748 * fVar131;
            auVar69._28_4_ = pfVar1[7];
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x222b21c + lVar109 * 4);
            auVar11 = vfmadd231ps_fma(auVar67,auVar126,auVar160);
            auVar12 = vfmadd231ps_fma(auVar68,auVar126,auVar198);
            auVar13 = vfmadd231ps_fma(auVar69,local_480,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x222ad98 + lVar109 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,auVar182);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_6a0);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_520,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x222a914 + lVar109 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,auVar174);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,local_540);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5c0,auVar126);
            auVar126 = vandps_avx(ZEXT1632(auVar7),local_2c0);
            auVar124 = vandps_avx(ZEXT1632(auVar8),local_2c0);
            auVar124 = vmaxps_avx(auVar126,auVar124);
            auVar126 = vandps_avx(ZEXT1632(auVar9),local_2c0);
            auVar126 = vmaxps_avx(auVar124,auVar126);
            auVar97._4_4_ = fStack_fc;
            auVar97._0_4_ = local_100;
            auVar97._8_4_ = fStack_f8;
            auVar97._12_4_ = fStack_f4;
            auVar97._16_4_ = fStack_f0;
            auVar97._20_4_ = fStack_ec;
            auVar97._24_4_ = fStack_e8;
            auVar97._28_4_ = fStack_e4;
            auVar126 = vcmpps_avx(auVar126,auVar97,1);
            auVar143 = vblendvps_avx(ZEXT1632(auVar7),auVar24,auVar126);
            auVar217 = vblendvps_avx(ZEXT1632(auVar8),auVar25,auVar126);
            auVar126 = vandps_avx(ZEXT1632(auVar11),local_2c0);
            auVar124 = vandps_avx(ZEXT1632(auVar12),local_2c0);
            auVar124 = vmaxps_avx(auVar126,auVar124);
            auVar126 = vandps_avx(local_2c0,ZEXT1632(auVar13));
            auVar126 = vmaxps_avx(auVar124,auVar126);
            auVar124 = vcmpps_avx(auVar126,auVar97,1);
            auVar126 = vblendvps_avx(ZEXT1632(auVar11),auVar24,auVar124);
            auVar124 = vblendvps_avx(ZEXT1632(auVar12),auVar25,auVar124);
            auVar22 = vfmadd213ps_fma(auVar116,local_5c0,ZEXT1632(auVar22));
            auVar7 = vfmadd213ps_fma(auVar143,auVar143,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar217,auVar217);
            auVar116 = vrsqrtps_avx(ZEXT1632(auVar7));
            fVar149 = auVar116._0_4_;
            fVar150 = auVar116._4_4_;
            fVar127 = auVar116._8_4_;
            fVar128 = auVar116._12_4_;
            fVar129 = auVar116._16_4_;
            fVar130 = auVar116._20_4_;
            fVar131 = auVar116._24_4_;
            auVar70._4_4_ = fVar150 * fVar150 * fVar150 * auVar7._4_4_ * -0.5;
            auVar70._0_4_ = fVar149 * fVar149 * fVar149 * auVar7._0_4_ * -0.5;
            auVar70._8_4_ = fVar127 * fVar127 * fVar127 * auVar7._8_4_ * -0.5;
            auVar70._12_4_ = fVar128 * fVar128 * fVar128 * auVar7._12_4_ * -0.5;
            auVar70._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar70._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar70._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
            auVar70._28_4_ = 0;
            auVar145._8_4_ = 0x3fc00000;
            auVar145._0_8_ = 0x3fc000003fc00000;
            auVar145._12_4_ = 0x3fc00000;
            auVar145._16_4_ = 0x3fc00000;
            auVar145._20_4_ = 0x3fc00000;
            auVar145._24_4_ = 0x3fc00000;
            auVar145._28_4_ = 0x3fc00000;
            auVar7 = vfmadd231ps_fma(auVar70,auVar145,auVar116);
            fVar149 = auVar7._0_4_;
            fVar150 = auVar7._4_4_;
            auVar71._4_4_ = auVar217._4_4_ * fVar150;
            auVar71._0_4_ = auVar217._0_4_ * fVar149;
            fVar127 = auVar7._8_4_;
            auVar71._8_4_ = auVar217._8_4_ * fVar127;
            fVar128 = auVar7._12_4_;
            auVar71._12_4_ = auVar217._12_4_ * fVar128;
            auVar71._16_4_ = auVar217._16_4_ * 0.0;
            auVar71._20_4_ = auVar217._20_4_ * 0.0;
            auVar71._24_4_ = auVar217._24_4_ * 0.0;
            auVar71._28_4_ = auVar217._28_4_;
            auVar72._4_4_ = fVar150 * -auVar143._4_4_;
            auVar72._0_4_ = fVar149 * -auVar143._0_4_;
            auVar72._8_4_ = fVar127 * -auVar143._8_4_;
            auVar72._12_4_ = fVar128 * -auVar143._12_4_;
            auVar72._16_4_ = -auVar143._16_4_ * 0.0;
            auVar72._20_4_ = -auVar143._20_4_ * 0.0;
            auVar72._24_4_ = -auVar143._24_4_ * 0.0;
            auVar72._28_4_ = auVar116._28_4_;
            auVar7 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar124,auVar124);
            auVar116 = vrsqrtps_avx(ZEXT1632(auVar7));
            auVar73._28_4_ = fVar214;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar128 * 0.0,
                                    CONCAT48(fVar127 * 0.0,CONCAT44(fVar150 * 0.0,fVar149 * 0.0))));
            fVar149 = auVar116._0_4_;
            fVar150 = auVar116._4_4_;
            fVar127 = auVar116._8_4_;
            fVar128 = auVar116._12_4_;
            fVar129 = auVar116._16_4_;
            fVar130 = auVar116._20_4_;
            fVar131 = auVar116._24_4_;
            auVar74._4_4_ = fVar150 * fVar150 * fVar150 * auVar7._4_4_ * -0.5;
            auVar74._0_4_ = fVar149 * fVar149 * fVar149 * auVar7._0_4_ * -0.5;
            auVar74._8_4_ = fVar127 * fVar127 * fVar127 * auVar7._8_4_ * -0.5;
            auVar74._12_4_ = fVar128 * fVar128 * fVar128 * auVar7._12_4_ * -0.5;
            auVar74._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar74._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar74._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
            auVar74._28_4_ = 0;
            auVar7 = vfmadd231ps_fma(auVar74,auVar145,auVar116);
            fVar149 = auVar7._0_4_;
            fVar150 = auVar7._4_4_;
            auVar75._4_4_ = auVar124._4_4_ * fVar150;
            auVar75._0_4_ = auVar124._0_4_ * fVar149;
            fVar127 = auVar7._8_4_;
            auVar75._8_4_ = auVar124._8_4_ * fVar127;
            fVar128 = auVar7._12_4_;
            auVar75._12_4_ = auVar124._12_4_ * fVar128;
            auVar75._16_4_ = auVar124._16_4_ * 0.0;
            auVar75._20_4_ = auVar124._20_4_ * 0.0;
            auVar75._24_4_ = auVar124._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._4_4_ = fVar150 * -auVar126._4_4_;
            auVar76._0_4_ = fVar149 * -auVar126._0_4_;
            auVar76._8_4_ = fVar127 * -auVar126._8_4_;
            auVar76._12_4_ = fVar128 * -auVar126._12_4_;
            auVar76._16_4_ = -auVar126._16_4_ * 0.0;
            auVar76._20_4_ = -auVar126._20_4_ * 0.0;
            auVar76._24_4_ = -auVar126._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar77._28_4_ = 0xbf000000;
            auVar77._0_28_ =
                 ZEXT1628(CONCAT412(fVar128 * 0.0,
                                    CONCAT48(fVar127 * 0.0,CONCAT44(fVar150 * 0.0,fVar149 * 0.0))));
            auVar7 = vfmadd213ps_fma(auVar71,auVar117,auVar161);
            auVar8 = vfmadd213ps_fma(auVar72,auVar117,auVar138);
            auVar9 = vfmadd213ps_fma(auVar73,auVar117,ZEXT1632(auVar22));
            auVar114 = vfnmadd213ps_fma(auVar71,auVar117,auVar161);
            auVar11 = vfmadd213ps_fma(auVar75,auVar196,local_560);
            auVar151 = vfnmadd213ps_fma(auVar72,auVar117,auVar138);
            auVar12 = vfmadd213ps_fma(auVar76,auVar196,auVar187);
            auVar134 = vfnmadd231ps_fma(ZEXT1632(auVar22),auVar117,auVar73);
            auVar22 = vfmadd213ps_fma(auVar77,auVar196,ZEXT1632(auVar21));
            auVar27 = vfnmadd213ps_fma(auVar75,auVar196,local_560);
            auVar115 = vfnmadd213ps_fma(auVar76,auVar196,auVar187);
            auVar135 = vfnmadd231ps_fma(ZEXT1632(auVar21),auVar196,auVar77);
            auVar116 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151));
            auVar126 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar134));
            auVar78._4_4_ = auVar116._4_4_ * auVar134._4_4_;
            auVar78._0_4_ = auVar116._0_4_ * auVar134._0_4_;
            auVar78._8_4_ = auVar116._8_4_ * auVar134._8_4_;
            auVar78._12_4_ = auVar116._12_4_ * auVar134._12_4_;
            auVar78._16_4_ = auVar116._16_4_ * 0.0;
            auVar78._20_4_ = auVar116._20_4_ * 0.0;
            auVar78._24_4_ = auVar116._24_4_ * 0.0;
            auVar78._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar78,ZEXT1632(auVar151),auVar126);
            auVar79._4_4_ = auVar114._4_4_ * auVar126._4_4_;
            auVar79._0_4_ = auVar114._0_4_ * auVar126._0_4_;
            auVar79._8_4_ = auVar114._8_4_ * auVar126._8_4_;
            auVar79._12_4_ = auVar114._12_4_ * auVar126._12_4_;
            auVar79._16_4_ = auVar126._16_4_ * 0.0;
            auVar79._20_4_ = auVar126._20_4_ * 0.0;
            auVar79._24_4_ = auVar126._24_4_ * 0.0;
            auVar79._28_4_ = auVar126._28_4_;
            auVar201 = ZEXT1632(auVar114);
            auVar126 = vsubps_avx(ZEXT1632(auVar11),auVar201);
            auVar164 = ZEXT1632(auVar134);
            auVar21 = vfmsub231ps_fma(auVar79,auVar164,auVar126);
            auVar80._4_4_ = auVar151._4_4_ * auVar126._4_4_;
            auVar80._0_4_ = auVar151._0_4_ * auVar126._0_4_;
            auVar80._8_4_ = auVar151._8_4_ * auVar126._8_4_;
            auVar80._12_4_ = auVar151._12_4_ * auVar126._12_4_;
            auVar80._16_4_ = auVar126._16_4_ * 0.0;
            auVar80._20_4_ = auVar126._20_4_ * 0.0;
            auVar80._24_4_ = auVar126._24_4_ * 0.0;
            auVar80._28_4_ = auVar126._28_4_;
            auVar114 = vfmsub231ps_fma(auVar80,auVar201,auVar116);
            auVar116 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar116,ZEXT1632(auVar21));
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar116,ZEXT1632(auVar13));
            auVar136 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar116 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar7),auVar136);
            auVar126 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar8),auVar136);
            auVar124 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar9),auVar136);
            auVar143 = vblendvps_avx(auVar201,ZEXT1632(auVar11),auVar136);
            auVar217 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar12),auVar136);
            auVar23 = vblendvps_avx(auVar164,ZEXT1632(auVar22),auVar136);
            auVar201 = vblendvps_avx(ZEXT1632(auVar11),auVar201,auVar136);
            auVar25 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151),auVar136);
            auVar21 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
            auVar164 = vblendvps_avx(ZEXT1632(auVar22),auVar164,auVar136);
            auVar201 = vsubps_avx(auVar201,auVar116);
            auVar25 = vsubps_avx(auVar25,auVar126);
            auVar138 = vsubps_avx(auVar164,auVar124);
            auVar161 = vsubps_avx(auVar116,auVar143);
            auVar187 = vsubps_avx(auVar126,auVar217);
            auVar198 = vsubps_avx(auVar124,auVar23);
            auVar189._0_4_ = auVar138._0_4_ * auVar116._0_4_;
            auVar189._4_4_ = auVar138._4_4_ * auVar116._4_4_;
            auVar189._8_4_ = auVar138._8_4_ * auVar116._8_4_;
            auVar189._12_4_ = auVar138._12_4_ * auVar116._12_4_;
            auVar189._16_4_ = auVar138._16_4_ * auVar116._16_4_;
            auVar189._20_4_ = auVar138._20_4_ * auVar116._20_4_;
            auVar189._24_4_ = auVar138._24_4_ * auVar116._24_4_;
            auVar189._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar189,auVar124,auVar201);
            auVar81._4_4_ = auVar201._4_4_ * auVar126._4_4_;
            auVar81._0_4_ = auVar201._0_4_ * auVar126._0_4_;
            auVar81._8_4_ = auVar201._8_4_ * auVar126._8_4_;
            auVar81._12_4_ = auVar201._12_4_ * auVar126._12_4_;
            auVar81._16_4_ = auVar201._16_4_ * auVar126._16_4_;
            auVar81._20_4_ = auVar201._20_4_ * auVar126._20_4_;
            auVar81._24_4_ = auVar201._24_4_ * auVar126._24_4_;
            auVar81._28_4_ = auVar164._28_4_;
            auVar7 = vfmsub231ps_fma(auVar81,auVar116,auVar25);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar22),_DAT_02020f00);
            auVar190._0_4_ = auVar25._0_4_ * auVar124._0_4_;
            auVar190._4_4_ = auVar25._4_4_ * auVar124._4_4_;
            auVar190._8_4_ = auVar25._8_4_ * auVar124._8_4_;
            auVar190._12_4_ = auVar25._12_4_ * auVar124._12_4_;
            auVar190._16_4_ = auVar25._16_4_ * auVar124._16_4_;
            auVar190._20_4_ = auVar25._20_4_ * auVar124._20_4_;
            auVar190._24_4_ = auVar25._24_4_ * auVar124._24_4_;
            auVar190._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar190,auVar126,auVar138);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
            auVar168 = ZEXT1664(auVar7);
            auVar191._0_4_ = auVar198._0_4_ * auVar143._0_4_;
            auVar191._4_4_ = auVar198._4_4_ * auVar143._4_4_;
            auVar191._8_4_ = auVar198._8_4_ * auVar143._8_4_;
            auVar191._12_4_ = auVar198._12_4_ * auVar143._12_4_;
            auVar191._16_4_ = auVar198._16_4_ * auVar143._16_4_;
            auVar191._20_4_ = auVar198._20_4_ * auVar143._20_4_;
            auVar191._24_4_ = auVar198._24_4_ * auVar143._24_4_;
            auVar191._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar191,auVar161,auVar23);
            auVar82._4_4_ = auVar187._4_4_ * auVar23._4_4_;
            auVar82._0_4_ = auVar187._0_4_ * auVar23._0_4_;
            auVar82._8_4_ = auVar187._8_4_ * auVar23._8_4_;
            auVar82._12_4_ = auVar187._12_4_ * auVar23._12_4_;
            auVar82._16_4_ = auVar187._16_4_ * auVar23._16_4_;
            auVar82._20_4_ = auVar187._20_4_ * auVar23._20_4_;
            auVar82._24_4_ = auVar187._24_4_ * auVar23._24_4_;
            auVar82._28_4_ = auVar23._28_4_;
            auVar8 = vfmsub231ps_fma(auVar82,auVar217,auVar198);
            auVar83._4_4_ = auVar161._4_4_ * auVar217._4_4_;
            auVar83._0_4_ = auVar161._0_4_ * auVar217._0_4_;
            auVar83._8_4_ = auVar161._8_4_ * auVar217._8_4_;
            auVar83._12_4_ = auVar161._12_4_ * auVar217._12_4_;
            auVar83._16_4_ = auVar161._16_4_ * auVar217._16_4_;
            auVar83._20_4_ = auVar161._20_4_ * auVar217._20_4_;
            auVar83._24_4_ = auVar161._24_4_ * auVar217._24_4_;
            auVar83._28_4_ = auVar217._28_4_;
            auVar9 = vfmsub231ps_fma(auVar83,auVar187,auVar143);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar143 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
            auVar143 = vcmpps_avx(auVar143,ZEXT832(0) << 0x20,2);
            auVar22 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
            auVar21 = vpand_avx(auVar21,auVar22);
            auVar143 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar143 >> 0x7f,0) == '\0') &&
                  (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar143 >> 0xbf,0) == '\0') &&
                (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar143[0x1f]) {
LAB_0199992a:
              auVar178 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            }
            else {
              auVar84._4_4_ = auVar25._4_4_ * auVar198._4_4_;
              auVar84._0_4_ = auVar25._0_4_ * auVar198._0_4_;
              auVar84._8_4_ = auVar25._8_4_ * auVar198._8_4_;
              auVar84._12_4_ = auVar25._12_4_ * auVar198._12_4_;
              auVar84._16_4_ = auVar25._16_4_ * auVar198._16_4_;
              auVar84._20_4_ = auVar25._20_4_ * auVar198._20_4_;
              auVar84._24_4_ = auVar25._24_4_ * auVar198._24_4_;
              auVar84._28_4_ = auVar143._28_4_;
              auVar12 = vfmsub231ps_fma(auVar84,auVar187,auVar138);
              auVar193._0_4_ = auVar138._0_4_ * auVar161._0_4_;
              auVar193._4_4_ = auVar138._4_4_ * auVar161._4_4_;
              auVar193._8_4_ = auVar138._8_4_ * auVar161._8_4_;
              auVar193._12_4_ = auVar138._12_4_ * auVar161._12_4_;
              auVar193._16_4_ = auVar138._16_4_ * auVar161._16_4_;
              auVar193._20_4_ = auVar138._20_4_ * auVar161._20_4_;
              auVar193._24_4_ = auVar138._24_4_ * auVar161._24_4_;
              auVar193._28_4_ = 0;
              auVar11 = vfmsub231ps_fma(auVar193,auVar201,auVar198);
              auVar85._4_4_ = auVar201._4_4_ * auVar187._4_4_;
              auVar85._0_4_ = auVar201._0_4_ * auVar187._0_4_;
              auVar85._8_4_ = auVar201._8_4_ * auVar187._8_4_;
              auVar85._12_4_ = auVar201._12_4_ * auVar187._12_4_;
              auVar85._16_4_ = auVar201._16_4_ * auVar187._16_4_;
              auVar85._20_4_ = auVar201._20_4_ * auVar187._20_4_;
              auVar85._24_4_ = auVar201._24_4_ * auVar187._24_4_;
              auVar85._28_4_ = auVar187._28_4_;
              auVar13 = vfmsub231ps_fma(auVar85,auVar161,auVar25);
              auVar22 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar11),ZEXT1632(auVar13));
              auVar9 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar12),ZEXT832(0) << 0x20);
              auVar143 = vrcpps_avx(ZEXT1632(auVar9));
              auVar218._8_4_ = 0x3f800000;
              auVar218._0_8_ = &DAT_3f8000003f800000;
              auVar218._12_4_ = 0x3f800000;
              auVar218._16_4_ = 0x3f800000;
              auVar218._20_4_ = 0x3f800000;
              auVar218._24_4_ = 0x3f800000;
              auVar218._28_4_ = 0x3f800000;
              auVar22 = vfnmadd213ps_fma(auVar143,ZEXT1632(auVar9),auVar218);
              auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar143,auVar143);
              auVar176._0_4_ = auVar13._0_4_ * auVar124._0_4_;
              auVar176._4_4_ = auVar13._4_4_ * auVar124._4_4_;
              auVar176._8_4_ = auVar13._8_4_ * auVar124._8_4_;
              auVar176._12_4_ = auVar13._12_4_ * auVar124._12_4_;
              auVar176._16_4_ = auVar124._16_4_ * 0.0;
              auVar176._20_4_ = auVar124._20_4_ * 0.0;
              auVar176._24_4_ = auVar124._24_4_ * 0.0;
              auVar176._28_4_ = 0;
              auVar11 = vfmadd231ps_fma(auVar176,ZEXT1632(auVar11),auVar126);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar116,ZEXT1632(auVar12));
              fVar149 = auVar22._0_4_;
              fVar150 = auVar22._4_4_;
              fVar127 = auVar22._8_4_;
              fVar128 = auVar22._12_4_;
              auVar124 = ZEXT1632(CONCAT412(fVar128 * auVar11._12_4_,
                                            CONCAT48(fVar127 * auVar11._8_4_,
                                                     CONCAT44(fVar150 * auVar11._4_4_,
                                                              fVar149 * auVar11._0_4_))));
              uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar177._4_4_ = uVar112;
              auVar177._0_4_ = uVar112;
              auVar177._8_4_ = uVar112;
              auVar177._12_4_ = uVar112;
              auVar177._16_4_ = uVar112;
              auVar177._20_4_ = uVar112;
              auVar177._24_4_ = uVar112;
              auVar177._28_4_ = uVar112;
              auVar96._4_4_ = uStack_11c;
              auVar96._0_4_ = local_120;
              auVar96._8_4_ = uStack_118;
              auVar96._12_4_ = uStack_114;
              auVar96._16_4_ = uStack_110;
              auVar96._20_4_ = uStack_10c;
              auVar96._24_4_ = uStack_108;
              auVar96._28_4_ = uStack_104;
              auVar116 = vcmpps_avx(auVar96,auVar124,2);
              auVar126 = vcmpps_avx(auVar124,auVar177,2);
              auVar116 = vandps_avx(auVar126,auVar116);
              auVar22 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
              auVar21 = vpand_avx(auVar21,auVar22);
              auVar116 = vpmovsxwd_avx2(auVar21);
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar116 >> 0x7f,0) == '\0') &&
                    (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar116 >> 0xbf,0) == '\0') &&
                  (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar116[0x1f]) goto LAB_0199992a;
              auVar116 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,4);
              auVar22 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
              auVar21 = vpand_avx(auVar21,auVar22);
              auVar116 = vpmovsxwd_avx2(auVar21);
              auVar178 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar116 >> 0x7f,0) != '\0') ||
                    (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0xbf,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar116[0x1f] < '\0') {
                auVar143 = ZEXT1632(CONCAT412(fVar128 * auVar7._12_4_,
                                              CONCAT48(fVar127 * auVar7._8_4_,
                                                       CONCAT44(fVar150 * auVar7._4_4_,
                                                                fVar149 * auVar7._0_4_))));
                auVar86._28_4_ = SUB84(uStack_5c8,4);
                auVar86._0_28_ =
                     ZEXT1628(CONCAT412(fVar128 * auVar8._12_4_,
                                        CONCAT48(fVar127 * auVar8._8_4_,
                                                 CONCAT44(fVar150 * auVar8._4_4_,
                                                          fVar149 * auVar8._0_4_))));
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = &DAT_3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx(auVar202,auVar143);
                _local_300 = vblendvps_avx(auVar126,auVar143,auVar136);
                auVar126 = vsubps_avx(auVar202,auVar86);
                local_4e0 = vblendvps_avx(auVar126,auVar86,auVar136);
                auVar168 = ZEXT3264(local_4e0);
                auVar178 = ZEXT3264(auVar116);
                local_500 = auVar124;
              }
            }
            auVar209 = ZEXT3264(auVar212);
            auVar116 = auVar178._0_32_;
            local_5a0 = auVar196;
            local_580 = auVar117;
            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar116 >> 0x7f,0) == '\0') &&
                  (auVar178 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar116 >> 0xbf,0) == '\0') &&
                (auVar178 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar178[0x1f]) {
              auVar192 = ZEXT3264(local_6a0);
              auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(
                                                  fVar214,CONCAT412(fVar214,CONCAT48(fVar214,
                                                  CONCAT44(fVar214,fVar214))))))));
            }
            else {
              auVar126 = vsubps_avx(auVar196,auVar117);
              auVar21 = vfmadd213ps_fma(auVar126,_local_300,auVar117);
              fVar149 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar87._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar149;
              auVar87._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar149;
              auVar87._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar149;
              auVar87._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar149;
              auVar87._16_4_ = fVar149 * 0.0;
              auVar87._20_4_ = fVar149 * 0.0;
              auVar87._24_4_ = fVar149 * 0.0;
              auVar87._28_4_ = fVar149;
              auVar126 = vcmpps_avx(local_500,auVar87,6);
              auVar124 = auVar116 & auVar126;
              auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(
                                                  fVar214,CONCAT412(fVar214,CONCAT48(fVar214,
                                                  CONCAT44(fVar214,fVar214))))))));
              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar124 >> 0x7f,0) == '\0') &&
                    (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar124 >> 0xbf,0) == '\0') &&
                  (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar124[0x1f]) {
                auVar192 = ZEXT3264(local_6a0);
              }
              else {
                local_380 = vandps_avx(auVar126,auVar116);
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar165._8_4_ = 0x40000000;
                auVar165._0_8_ = 0x4000000040000000;
                auVar165._12_4_ = 0x40000000;
                auVar165._16_4_ = 0x40000000;
                auVar165._20_4_ = 0x40000000;
                auVar165._24_4_ = 0x40000000;
                auVar165._28_4_ = 0x40000000;
                auVar168 = ZEXT3264(auVar165);
                auVar21 = vfmadd213ps_fma(local_4e0,auVar165,auVar146);
                auVar178 = ZEXT1664(auVar21);
                local_440 = _local_300;
                local_420 = ZEXT1632(auVar21);
                local_3d0 = local_7d0;
                uStack_3c8 = uStack_7c8;
                local_3c0 = local_610._0_8_;
                uStack_3b8 = local_610._8_8_;
                local_3b0 = local_620._0_8_;
                uStack_3a8 = local_620._8_8_;
                local_3a0 = local_600;
                local_780 = (undefined1  [8])(context->scene->geometries).items[uVar15].ptr;
                local_4e0 = local_420;
                if ((((Geometry *)local_780)->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar110 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar110 = true,
                        ((Geometry *)local_780)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uStack_778 = SUB168(*pauVar2,8);
                  fVar149 = (float)local_3e0;
                  auVar168 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar149,CONCAT420(fVar149,
                                                  CONCAT416(fVar149,CONCAT412(fVar149,CONCAT48(
                                                  fVar149,CONCAT44(fVar149,fVar149))))))));
                  local_360[0] = (fVar149 + (float)local_300._0_4_ + 0.0) * local_180;
                  local_360[1] = (fVar149 + (float)local_300._4_4_ + 1.0) * fStack_17c;
                  local_360[2] = (fVar149 + fStack_2f8 + 2.0) * fStack_178;
                  local_360[3] = (fVar149 + fStack_2f4 + 3.0) * fStack_174;
                  fStack_350 = (fVar149 + fStack_2f0 + 4.0) * fStack_170;
                  fStack_34c = (fVar149 + fStack_2ec + 5.0) * fStack_16c;
                  fStack_348 = (fVar149 + fStack_2e8 + 6.0) * fStack_168;
                  fStack_344 = fVar149 + fStack_2e4 + 7.0;
                  local_4e0._0_8_ = auVar21._0_8_;
                  local_4e0._8_8_ = auVar21._8_8_;
                  local_340 = local_4e0._0_8_;
                  uStack_338 = local_4e0._8_8_;
                  uStack_330 = 0;
                  uStack_328 = 0;
                  local_320 = local_500;
                  uVar106 = vmovmskps_avx(local_380);
                  bVar110 = uVar106 != 0;
                  if (bVar110) {
                    local_980 = 0;
                    local_940 = (ulong)(uVar106 & 0xff);
                    for (uVar104 = local_940; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                      local_980 = local_980 + 1;
                    }
                    local_6c0 = ZEXT1632(local_610);
                    auStack_6d0 = auVar24._16_16_;
                    local_6e0 = local_620;
                    _local_700 = ZEXT1632(local_600);
                    local_400 = local_500;
                    local_3dc = iVar103;
                    do {
                      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_240 = local_360[local_980];
                      local_220._4_4_ = *(undefined4 *)((long)&local_340 + local_980 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_320 + local_980 * 4);
                      fVar127 = 1.0 - local_240;
                      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar127 * fVar127)),
                                                ZEXT416((uint)(local_240 * fVar127)),
                                                ZEXT416(0xc0000000));
                      auVar21 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar127)),
                                                ZEXT416((uint)(local_240 * local_240)),
                                                ZEXT416(0x40000000));
                      fVar149 = auVar21._0_4_ * 3.0;
                      fVar150 = local_240 * local_240 * 3.0;
                      auVar184._0_4_ = fVar150 * (float)local_700._0_4_;
                      auVar184._4_4_ = fVar150 * (float)local_700._4_4_;
                      auVar184._8_4_ = fVar150 * fStack_6f8;
                      auVar184._12_4_ = fVar150 * fStack_6f4;
                      auVar154._4_4_ = fVar149;
                      auVar154._0_4_ = fVar149;
                      auVar154._8_4_ = fVar149;
                      auVar154._12_4_ = fVar149;
                      auVar21 = vfmadd132ps_fma(auVar154,auVar184,local_6e0);
                      fVar149 = auVar22._0_4_ * 3.0;
                      auVar180._4_4_ = fVar149;
                      auVar180._0_4_ = fVar149;
                      auVar180._8_4_ = fVar149;
                      auVar180._12_4_ = fVar149;
                      auVar21 = vfmadd132ps_fma(auVar180,auVar21,local_6c0._0_16_);
                      fVar149 = fVar127 * fVar127 * -3.0;
                      local_7b0.context = context->user;
                      auVar155._4_4_ = fVar149;
                      auVar155._0_4_ = fVar149;
                      auVar155._8_4_ = fVar149;
                      auVar155._12_4_ = fVar149;
                      auVar22 = vfmadd132ps_fma(auVar155,auVar21,auVar10);
                      local_2a0 = auVar22._0_4_;
                      uStack_29c = local_2a0;
                      uStack_298 = local_2a0;
                      uStack_294 = local_2a0;
                      uStack_290 = local_2a0;
                      uStack_28c = local_2a0;
                      uStack_288 = local_2a0;
                      uStack_284 = local_2a0;
                      auVar21 = vmovshdup_avx(auVar22);
                      auVar172._0_8_ = auVar21._0_8_;
                      auVar172._8_8_ = auVar172._0_8_;
                      local_280._16_8_ = auVar172._0_8_;
                      local_280._0_16_ = auVar172;
                      local_280._24_8_ = auVar172._0_8_;
                      auVar178 = ZEXT3264(local_280);
                      auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
                      auVar156._0_8_ = auVar21._0_8_;
                      auVar156._8_8_ = auVar156._0_8_;
                      local_260._16_8_ = auVar156._0_8_;
                      local_260._0_16_ = auVar156;
                      local_260._24_8_ = auVar156._0_8_;
                      auVar168 = ZEXT3264(local_260);
                      fStack_23c = local_240;
                      fStack_238 = local_240;
                      fStack_234 = local_240;
                      fStack_230 = local_240;
                      fStack_22c = local_240;
                      fStack_228 = local_240;
                      fStack_224 = local_240;
                      local_220._0_4_ = local_220._4_4_;
                      local_220._8_4_ = local_220._4_4_;
                      local_220._12_4_ = local_220._4_4_;
                      local_220._16_4_ = local_220._4_4_;
                      local_220._20_4_ = local_220._4_4_;
                      local_220._24_4_ = local_220._4_4_;
                      local_220._28_4_ = local_220._4_4_;
                      local_200 = CONCAT44(uStack_15c,local_160);
                      uStack_1f8 = CONCAT44(uStack_154,uStack_158);
                      uStack_1f0 = CONCAT44(uStack_14c,uStack_150);
                      uStack_1e8 = CONCAT44(uStack_144,uStack_148);
                      local_1e0._4_4_ = uStack_13c;
                      local_1e0._0_4_ = local_140;
                      local_1e0._8_4_ = uStack_138;
                      local_1e0._12_4_ = uStack_134;
                      local_1e0._16_4_ = uStack_130;
                      local_1e0._20_4_ = uStack_12c;
                      local_1e0._24_4_ = uStack_128;
                      local_1e0._28_4_ = uStack_124;
                      vpcmpeqd_avx2(local_1e0,local_1e0);
                      local_1c0 = (local_7b0.context)->instID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = (local_7b0.context)->instPrimID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_640 = local_2e0._0_8_;
                      uStack_638 = local_2e0._8_8_;
                      uStack_630 = local_2e0._16_8_;
                      uStack_628 = local_2e0._24_8_;
                      local_7b0.valid = (int *)&local_640;
                      local_7b0.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                      local_7b0.hit = (RTCHitN *)&local_2a0;
                      local_7b0.N = 8;
                      local_7b0.ray = (RTCRayN *)ray;
                      if (*(code **)((long)local_780 + 0x48) != (code *)0x0) {
                        auVar168 = ZEXT1664(auVar156);
                        auVar178 = ZEXT1664(auVar172);
                        (**(code **)((long)local_780 + 0x48))(&local_7b0);
                      }
                      auVar92._8_8_ = uStack_638;
                      auVar92._0_8_ = local_640;
                      auVar92._16_8_ = uStack_630;
                      auVar92._24_8_ = uStack_628;
                      auVar126 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar92);
                      auVar116 = _DAT_0205a980 & ~auVar126;
                      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar116 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar116 >> 0x7f,0) == '\0') &&
                            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar116 >> 0xbf,0) == '\0') &&
                          (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar116[0x1f]) {
                        auVar126 = auVar126 ^ _DAT_0205a980;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                          auVar178 = ZEXT1664(auVar178._0_16_);
                          (*p_Var20)(&local_7b0);
                        }
                        auVar93._8_8_ = uStack_638;
                        auVar93._0_8_ = local_640;
                        auVar93._16_8_ = uStack_630;
                        auVar93._24_8_ = uStack_628;
                        auVar116 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar93)
                        ;
                        auVar126 = auVar116 ^ _DAT_0205a980;
                        auVar166._8_4_ = 0xff800000;
                        auVar166._0_8_ = 0xff800000ff800000;
                        auVar166._12_4_ = 0xff800000;
                        auVar166._16_4_ = 0xff800000;
                        auVar166._20_4_ = 0xff800000;
                        auVar166._24_4_ = 0xff800000;
                        auVar166._28_4_ = 0xff800000;
                        auVar168 = ZEXT3264(auVar166);
                        auVar116 = vblendvps_avx(auVar166,*(undefined1 (*) [32])
                                                           (local_7b0.ray + 0x100),auVar116);
                        *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar116;
                      }
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') break;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                      uVar104 = local_980 & 0x3f;
                      local_980 = 0;
                      local_940 = local_940 ^ 1L << uVar104;
                      for (uVar104 = local_940; (uVar104 & 1) == 0;
                          uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                        local_980 = local_980 + 1;
                      }
                      bVar110 = local_940 != 0;
                    } while (bVar110);
                  }
                  auVar197 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,
                                                  CONCAT416(fVar214,CONCAT412(fVar214,CONCAT48(
                                                  fVar214,CONCAT44(fVar214,fVar214))))))));
                }
                auVar209 = ZEXT3264(auVar212);
                bVar111 = (bool)(bVar111 | bVar110);
                auVar192 = ZEXT3264(local_6a0);
              }
            }
          }
          lVar109 = lVar109 + 8;
        } while ((int)lVar109 < iVar103);
      }
      if (bVar111) {
        return local_98d;
      }
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar125._4_4_ = uVar112;
      auVar125._0_4_ = uVar112;
      auVar125._8_4_ = uVar112;
      auVar125._12_4_ = uVar112;
      auVar125._16_4_ = uVar112;
      auVar125._20_4_ = uVar112;
      auVar125._24_4_ = uVar112;
      auVar125._28_4_ = uVar112;
      auVar116 = vcmpps_avx(local_80,auVar125,2);
      uVar106 = vmovmskps_avx(auVar116);
      uVar102 = uVar102 & uVar102 + 0xff & uVar106;
      local_98d = uVar102 != 0;
    } while (local_98d);
  }
  return local_98d;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }